

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx::ConeCurveMiMBIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar82;
  uint uVar83;
  ulong uVar84;
  long lVar85;
  uint uVar86;
  undefined1 auVar87 [8];
  ulong uVar88;
  long lVar89;
  float fVar90;
  float fVar104;
  float fVar106;
  undefined1 auVar91 [16];
  float fVar110;
  float fVar112;
  float fVar114;
  undefined1 auVar93 [32];
  float fVar108;
  float fVar116;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar105;
  float fVar107;
  float fVar109;
  float fVar111;
  float fVar113;
  float fVar115;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar117;
  float fVar127;
  undefined1 auVar118 [32];
  float fVar128;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar129;
  float fVar130;
  undefined4 uVar131;
  float fVar145;
  undefined1 auVar132 [16];
  float fVar142;
  float fVar143;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar144;
  float fVar146;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar150;
  float fVar154;
  float fVar155;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar156;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar169;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar187;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  float fVar188;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [28];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  float fVar213;
  float fVar214;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  float fVar230;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar241;
  undefined1 auVar234 [64];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  float fVar244;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar255;
  undefined1 auVar248 [64];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined8 local_600;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  size_t local_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar92 [32];
  
  pSVar9 = context->scene;
  uVar83 = line->sharedGeomID;
  pGVar10 = (pSVar9->geometries).items[uVar83].ptr;
  fVar214 = (pGVar10->time_range).lower;
  fVar214 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar214) / ((pGVar10->time_range).upper - fVar214));
  auVar41 = vroundss_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),9);
  auVar41 = vminss_avx(auVar41,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar41 = vmaxss_avx(ZEXT816(0),auVar41);
  uVar82 = (line->v0).field_0.i[0];
  lVar89 = *(long *)&pGVar10[3].time_range.upper;
  lVar85 = (long)(int)auVar41._0_4_ * 0x38;
  lVar11 = *(long *)(lVar89 + lVar85);
  lVar12 = *(long *)(lVar89 + 0x10 + lVar85);
  uVar86 = (line->v0).field_0.i[1];
  uVar3 = (line->v0).field_0.i[2];
  uVar4 = (line->v0).field_0.i[4];
  puVar1 = (undefined8 *)(lVar11 + lVar12 * (ulong)uVar4);
  uStack_6b0 = *puVar1;
  _local_6c0 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar82);
  uStack_6a8 = puVar1[1];
  uVar5 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar11 + lVar12 * (ulong)uVar5);
  uStack_5b0 = *puVar1;
  _local_5c0 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar86);
  uStack_5a8 = puVar1[1];
  uVar6 = (line->v0).field_0.i[6];
  auVar157._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar6);
  auVar157._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar3);
  uVar7 = (line->v0).field_0.i[3];
  uVar8 = (line->v0).field_0.i[7];
  auVar170._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar8);
  auVar170._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar7);
  auVar180._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar4 + 1));
  auVar180._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar82 + 1));
  auVar189._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar5 + 1));
  auVar189._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar86 + 1));
  auVar202._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar6 + 1));
  auVar202._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar3 + 1));
  auVar210._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar8 + 1));
  auVar210._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar7 + 1));
  lVar11 = *(long *)(lVar89 + 0x38 + lVar85);
  lVar89 = *(long *)(lVar89 + 0x48 + lVar85);
  auVar215._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar4 * lVar89);
  auVar215._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar82 * lVar89);
  auVar225._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * lVar89);
  auVar225._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar86 * lVar89);
  auVar231._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * lVar89);
  auVar231._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar3 * lVar89);
  auVar245._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar8 * lVar89);
  auVar245._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * lVar89);
  auVar133._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar4 + 1) * lVar89);
  auVar133._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar82 + 1) * lVar89);
  auVar118._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * lVar89);
  auVar118._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar3 + 1) * lVar89);
  fVar214 = fVar214 - auVar41._0_4_;
  auVar206 = vunpcklps_avx(_local_6c0,auVar157);
  auVar161 = vunpckhps_avx(_local_6c0,auVar157);
  auVar233 = vunpcklps_avx(_local_5c0,auVar170);
  auVar193 = vunpckhps_avx(_local_5c0,auVar170);
  auVar43 = vunpcklps_avx(auVar206,auVar233);
  auVar206 = vunpckhps_avx(auVar206,auVar233);
  auVar44 = vunpcklps_avx(auVar161,auVar193);
  auVar161 = vunpckhps_avx(auVar161,auVar193);
  auVar242 = vunpcklps_avx(auVar180,auVar202);
  auVar193 = vunpckhps_avx(auVar180,auVar202);
  auVar247 = vunpcklps_avx(auVar189,auVar210);
  auVar233 = vunpckhps_avx(auVar189,auVar210);
  auVar45 = vunpcklps_avx(auVar242,auVar247);
  auVar242 = vunpckhps_avx(auVar242,auVar247);
  auVar46 = vunpcklps_avx(auVar193,auVar233);
  auVar193 = vunpckhps_avx(auVar193,auVar233);
  auVar257 = vunpcklps_avx(auVar215,auVar231);
  auVar233 = vunpckhps_avx(auVar215,auVar231);
  auVar47 = vunpcklps_avx(auVar225,auVar245);
  auVar247 = vunpckhps_avx(auVar225,auVar245);
  auVar92 = vunpcklps_avx(auVar257,auVar47);
  auVar257 = vunpckhps_avx(auVar257,auVar47);
  auVar93 = vunpcklps_avx(auVar233,auVar247);
  auVar233 = vunpckhps_avx(auVar233,auVar247);
  auVar48 = vunpcklps_avx(auVar133,auVar118);
  auVar247 = vunpckhps_avx(auVar133,auVar118);
  auVar134._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * lVar89);
  auVar134._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar86 + 1) * lVar89);
  auVar232._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar89 * (ulong)(uVar8 + 1));
  auVar232._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar7 + 1) * lVar89);
  auVar118 = vunpcklps_avx(auVar134,auVar232);
  auVar47 = vunpckhps_avx(auVar134,auVar232);
  auVar119 = vunpcklps_avx(auVar48,auVar118);
  auVar48 = vunpckhps_avx(auVar48,auVar118);
  auVar118 = vunpcklps_avx(auVar247,auVar47);
  auVar247 = vunpckhps_avx(auVar247,auVar47);
  auVar41 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
  auVar42 = vshufps_avx(ZEXT416((uint)(1.0 - fVar214)),ZEXT416((uint)(1.0 - fVar214)),0);
  fVar214 = auVar41._0_4_;
  fVar219 = auVar41._4_4_;
  fVar130 = auVar41._8_4_;
  fVar116 = auVar41._12_4_;
  fVar150 = auVar92._28_4_;
  fVar129 = auVar42._0_4_;
  fVar105 = auVar42._4_4_;
  fVar143 = auVar42._8_4_;
  fVar145 = auVar42._12_4_;
  auVar226._0_4_ = auVar92._0_4_ * fVar214 + fVar129 * auVar43._0_4_;
  auVar226._4_4_ = auVar92._4_4_ * fVar219 + fVar105 * auVar43._4_4_;
  auVar226._8_4_ = auVar92._8_4_ * fVar130 + fVar143 * auVar43._8_4_;
  auVar226._12_4_ = auVar92._12_4_ * fVar116 + fVar145 * auVar43._12_4_;
  auVar226._16_4_ = auVar92._16_4_ * fVar214 + fVar129 * auVar43._16_4_;
  auVar226._20_4_ = auVar92._20_4_ * fVar219 + fVar105 * auVar43._20_4_;
  auVar226._24_4_ = auVar92._24_4_ * fVar130 + fVar143 * auVar43._24_4_;
  auVar226._28_4_ = fVar150 + auVar43._28_4_;
  auVar256._0_4_ = auVar206._0_4_ * fVar129 + fVar214 * auVar257._0_4_;
  auVar256._4_4_ = auVar206._4_4_ * fVar105 + fVar219 * auVar257._4_4_;
  auVar256._8_4_ = auVar206._8_4_ * fVar143 + fVar130 * auVar257._8_4_;
  auVar256._12_4_ = auVar206._12_4_ * fVar145 + fVar116 * auVar257._12_4_;
  auVar256._16_4_ = auVar206._16_4_ * fVar129 + fVar214 * auVar257._16_4_;
  auVar256._20_4_ = auVar206._20_4_ * fVar105 + fVar219 * auVar257._20_4_;
  auVar256._24_4_ = auVar206._24_4_ * fVar143 + fVar130 * auVar257._24_4_;
  auVar256._28_4_ = fVar150 + auVar257._28_4_;
  auVar158._0_4_ = auVar44._0_4_ * fVar129 + auVar93._0_4_ * fVar214;
  auVar158._4_4_ = auVar44._4_4_ * fVar105 + auVar93._4_4_ * fVar219;
  auVar158._8_4_ = auVar44._8_4_ * fVar143 + auVar93._8_4_ * fVar130;
  auVar158._12_4_ = auVar44._12_4_ * fVar145 + auVar93._12_4_ * fVar116;
  auVar158._16_4_ = auVar44._16_4_ * fVar129 + auVar93._16_4_ * fVar214;
  auVar158._20_4_ = auVar44._20_4_ * fVar105 + auVar93._20_4_ * fVar219;
  auVar158._24_4_ = auVar44._24_4_ * fVar143 + auVar93._24_4_ * fVar130;
  auVar158._28_4_ = fVar150 + auVar93._28_4_;
  auVar216._8_4_ = 0x3f800000;
  auVar216._0_8_ = &DAT_3f8000003f800000;
  auVar216._12_4_ = 0x3f800000;
  auVar216._16_4_ = 0x3f800000;
  auVar216._20_4_ = 0x3f800000;
  auVar216._24_4_ = 0x3f800000;
  auVar216._28_4_ = 0x3f800000;
  fVar169 = auVar233._0_4_ * fVar214 + fVar129 * auVar161._0_4_;
  fVar174 = auVar233._4_4_ * fVar219 + fVar105 * auVar161._4_4_;
  fVar175 = auVar233._8_4_ * fVar130 + fVar143 * auVar161._8_4_;
  fVar176 = auVar233._12_4_ * fVar116 + fVar145 * auVar161._12_4_;
  fVar177 = auVar233._16_4_ * fVar214 + fVar129 * auVar161._16_4_;
  fVar178 = auVar233._20_4_ * fVar219 + fVar105 * auVar161._20_4_;
  fVar179 = auVar233._24_4_ * fVar130 + fVar143 * auVar161._24_4_;
  fStack_624 = auVar233._28_4_ + auVar161._28_4_;
  local_640._4_4_ = fVar174;
  local_640._0_4_ = fVar169;
  fStack_638 = fVar175;
  fStack_634 = fVar176;
  fStack_630 = fVar177;
  fStack_62c = fVar178;
  fStack_628 = fVar179;
  local_5a0._0_4_ = fVar129 * auVar45._0_4_ + auVar119._0_4_ * fVar214;
  local_5a0._4_4_ = fVar105 * auVar45._4_4_ + auVar119._4_4_ * fVar219;
  fStack_598 = fVar143 * auVar45._8_4_ + auVar119._8_4_ * fVar130;
  fStack_594 = fVar145 * auVar45._12_4_ + auVar119._12_4_ * fVar116;
  fStack_590 = fVar129 * auVar45._16_4_ + auVar119._16_4_ * fVar214;
  fStack_58c = fVar105 * auVar45._20_4_ + auVar119._20_4_ * fVar219;
  fStack_588 = fVar143 * auVar45._24_4_ + auVar119._24_4_ * fVar130;
  fStack_584 = fVar116 + fStack_624;
  local_680._0_4_ = auVar242._0_4_;
  local_680._4_4_ = auVar242._4_4_;
  fStack_678 = auVar242._8_4_;
  fStack_674 = auVar242._12_4_;
  fStack_670 = auVar242._16_4_;
  fStack_66c = auVar242._20_4_;
  fStack_668 = auVar242._24_4_;
  auVar246._0_4_ = auVar48._0_4_ * fVar214 + fVar129 * (float)local_680._0_4_;
  auVar246._4_4_ = auVar48._4_4_ * fVar219 + fVar105 * (float)local_680._4_4_;
  auVar246._8_4_ = auVar48._8_4_ * fVar130 + fVar143 * fStack_678;
  auVar246._12_4_ = auVar48._12_4_ * fVar116 + fVar145 * fStack_674;
  auVar246._16_4_ = auVar48._16_4_ * fVar214 + fVar129 * fStack_670;
  auVar246._20_4_ = auVar48._20_4_ * fVar219 + fVar105 * fStack_66c;
  auVar246._24_4_ = auVar48._24_4_ * fVar130 + fVar143 * fStack_668;
  auVar246._28_4_ = auVar233._28_4_ + fVar116;
  local_5c0._0_4_ = auVar46._0_4_;
  local_5c0._4_4_ = auVar46._4_4_;
  fStack_5b8 = auVar46._8_4_;
  fStack_5b4 = auVar46._12_4_;
  uStack_5b0._0_4_ = auVar46._16_4_;
  uStack_5b0._4_4_ = auVar46._20_4_;
  uStack_5a8._0_4_ = auVar46._24_4_;
  auVar181._0_4_ = fVar129 * (float)local_5c0._0_4_ + fVar214 * auVar118._0_4_;
  auVar181._4_4_ = fVar105 * (float)local_5c0._4_4_ + fVar219 * auVar118._4_4_;
  auVar181._8_4_ = fVar143 * fStack_5b8 + fVar130 * auVar118._8_4_;
  auVar181._12_4_ = fVar145 * fStack_5b4 + fVar116 * auVar118._12_4_;
  auVar181._16_4_ = fVar129 * (float)uStack_5b0 + fVar214 * auVar118._16_4_;
  auVar181._20_4_ = fVar105 * uStack_5b0._4_4_ + fVar219 * auVar118._20_4_;
  auVar181._24_4_ = fVar143 * (float)uStack_5a8 + fVar130 * auVar118._24_4_;
  auVar181._28_4_ = fVar116 + auVar118._28_4_;
  local_6c0._0_4_ = auVar193._0_4_;
  local_6c0._4_4_ = auVar193._4_4_;
  fStack_6b8 = auVar193._8_4_;
  fStack_6b4 = auVar193._12_4_;
  uStack_6b0._0_4_ = auVar193._16_4_;
  uStack_6b0._4_4_ = auVar193._20_4_;
  uStack_6a8._0_4_ = auVar193._24_4_;
  auVar91._0_4_ = fVar129 * (float)local_6c0._0_4_ + fVar214 * auVar247._0_4_;
  auVar91._4_4_ = fVar105 * (float)local_6c0._4_4_ + fVar219 * auVar247._4_4_;
  auVar91._8_4_ = fVar143 * fStack_6b8 + fVar130 * auVar247._8_4_;
  auVar91._12_4_ = fVar145 * fStack_6b4 + fVar116 * auVar247._12_4_;
  auVar92._16_4_ = fVar129 * (float)uStack_6b0 + fVar214 * auVar247._16_4_;
  auVar92._0_16_ = auVar91;
  auVar92._20_4_ = fVar105 * uStack_6b0._4_4_ + fVar219 * auVar247._20_4_;
  auVar92._24_4_ = fVar143 * (float)uStack_6a8 + fVar130 * auVar247._24_4_;
  auVar92._28_4_ = auVar118._28_4_ + auVar247._28_4_;
  auVar41 = vpcmpeqd_avx(auVar91,auVar91);
  auVar42 = vpcmpeqd_avx(auVar41,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar41 = vpcmpeqd_avx(auVar41,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_250 = vshufps_avx(ZEXT416(uVar83),ZEXT416(uVar83),0);
  local_260 = local_250;
  local_6c0._4_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
  local_300 = *(float *)(ray + k * 4 + 0xa0);
  local_4e0 = *(float *)(ray + k * 4 + 0xc0);
  auVar132 = ZEXT416((uint)((float)local_6c0._4_4_ * (float)local_6c0._4_4_ +
                           local_300 * local_300 + local_4e0 * local_4e0));
  auVar132 = vshufps_avx(auVar132,auVar132,0);
  auVar135._16_16_ = auVar132;
  auVar135._0_16_ = auVar132;
  auVar161 = vrcpps_avx(auVar135);
  auVar93._16_16_ = auVar41;
  auVar93._0_16_ = auVar42;
  fVar150 = auVar161._0_4_;
  fVar129 = auVar161._4_4_;
  auVar193._4_4_ = fVar129 * auVar132._4_4_;
  auVar193._0_4_ = fVar150 * auVar132._0_4_;
  fVar105 = auVar161._8_4_;
  auVar193._8_4_ = fVar105 * auVar132._8_4_;
  fVar143 = auVar161._12_4_;
  auVar193._12_4_ = fVar143 * auVar132._12_4_;
  fVar145 = auVar161._16_4_;
  auVar193._16_4_ = fVar145 * auVar132._0_4_;
  fVar154 = auVar161._20_4_;
  auVar193._20_4_ = fVar154 * auVar132._4_4_;
  fVar155 = auVar161._24_4_;
  auVar193._24_4_ = fVar155 * auVar132._8_4_;
  auVar193._28_4_ = auVar41._12_4_;
  auVar193 = vsubps_avx(auVar216,auVar193);
  fVar116 = auVar161._28_4_ + auVar193._28_4_;
  auVar233._4_4_ = (auVar226._4_4_ + (float)local_5a0._4_4_) * 0.5;
  auVar233._0_4_ = (auVar226._0_4_ + (float)local_5a0._0_4_) * 0.5;
  auVar233._8_4_ = (auVar226._8_4_ + fStack_598) * 0.5;
  auVar233._12_4_ = (auVar226._12_4_ + fStack_594) * 0.5;
  auVar233._16_4_ = (auVar226._16_4_ + fStack_590) * 0.5;
  auVar233._20_4_ = (auVar226._20_4_ + fStack_58c) * 0.5;
  auVar233._24_4_ = (auVar226._24_4_ + fStack_588) * 0.5;
  auVar233._28_4_ = auVar226._28_4_ + fStack_584;
  auVar161._4_4_ = (auVar256._4_4_ + auVar246._4_4_) * 0.5;
  auVar161._0_4_ = (auVar256._0_4_ + auVar246._0_4_) * 0.5;
  auVar161._8_4_ = (auVar256._8_4_ + auVar246._8_4_) * 0.5;
  auVar161._12_4_ = (auVar256._12_4_ + auVar246._12_4_) * 0.5;
  auVar161._16_4_ = (auVar256._16_4_ + auVar246._16_4_) * 0.5;
  auVar161._20_4_ = (auVar256._20_4_ + auVar246._20_4_) * 0.5;
  auVar161._24_4_ = (auVar256._24_4_ + auVar246._24_4_) * 0.5;
  auVar161._28_4_ = auVar256._28_4_ + auVar246._28_4_;
  auVar206._4_4_ = (auVar158._4_4_ + auVar181._4_4_) * 0.5;
  auVar206._0_4_ = (auVar158._0_4_ + auVar181._0_4_) * 0.5;
  auVar206._8_4_ = (auVar158._8_4_ + auVar181._8_4_) * 0.5;
  auVar206._12_4_ = (auVar158._12_4_ + auVar181._12_4_) * 0.5;
  auVar206._16_4_ = (auVar158._16_4_ + auVar181._16_4_) * 0.5;
  auVar206._20_4_ = (auVar158._20_4_ + auVar181._20_4_) * 0.5;
  auVar206._24_4_ = (auVar158._24_4_ + auVar181._24_4_) * 0.5;
  auVar206._28_4_ = 0x3f000000;
  fVar214 = *(float *)(ray + k * 4 + 0x20);
  auVar171._4_4_ = fVar214;
  auVar171._0_4_ = fVar214;
  auVar171._8_4_ = fVar214;
  auVar171._12_4_ = fVar214;
  auVar171._16_4_ = fVar214;
  auVar171._20_4_ = fVar214;
  auVar171._24_4_ = fVar214;
  auVar171._28_4_ = fVar214;
  auVar161 = vsubps_avx(auVar161,auVar171);
  fVar219 = *(float *)(ray + k * 4 + 0x40);
  auVar190._4_4_ = fVar219;
  auVar190._0_4_ = fVar219;
  auVar190._8_4_ = fVar219;
  auVar190._12_4_ = fVar219;
  auVar190._16_4_ = fVar219;
  auVar190._20_4_ = fVar219;
  auVar190._24_4_ = fVar219;
  auVar190._28_4_ = fVar219;
  auVar206 = vsubps_avx(auVar206,auVar190);
  fVar130 = *(float *)(ray + k * 4);
  auVar151._4_4_ = fVar130;
  auVar151._0_4_ = fVar130;
  auVar151._8_4_ = fVar130;
  auVar151._12_4_ = fVar130;
  auVar151._16_4_ = fVar130;
  auVar151._20_4_ = fVar130;
  auVar151._24_4_ = fVar130;
  auVar151._28_4_ = fVar130;
  auVar233 = vsubps_avx(auVar233,auVar151);
  fStack_5e4 = auVar233._28_4_ + auVar161._28_4_ + auVar206._28_4_;
  fVar117 = ((float)local_6c0._4_4_ * auVar233._0_4_ +
            local_300 * auVar161._0_4_ + local_4e0 * auVar206._0_4_) *
            (fVar150 + fVar150 * auVar193._0_4_);
  fVar127 = ((float)local_6c0._4_4_ * auVar233._4_4_ +
            local_300 * auVar161._4_4_ + local_4e0 * auVar206._4_4_) *
            (fVar129 + fVar129 * auVar193._4_4_);
  fStack_5f8 = ((float)local_6c0._4_4_ * auVar233._8_4_ +
               local_300 * auVar161._8_4_ + local_4e0 * auVar206._8_4_) *
               (fVar105 + fVar105 * auVar193._8_4_);
  fStack_5f4 = ((float)local_6c0._4_4_ * auVar233._12_4_ +
               local_300 * auVar161._12_4_ + local_4e0 * auVar206._12_4_) *
               (fVar143 + fVar143 * auVar193._12_4_);
  fStack_5f0 = ((float)local_6c0._4_4_ * auVar233._16_4_ +
               local_300 * auVar161._16_4_ + local_4e0 * auVar206._16_4_) *
               (fVar145 + fVar145 * auVar193._16_4_);
  fStack_5ec = ((float)local_6c0._4_4_ * auVar233._20_4_ +
               local_300 * auVar161._20_4_ + local_4e0 * auVar206._20_4_) *
               (fVar154 + fVar154 * auVar193._20_4_);
  fStack_5e8 = ((float)local_6c0._4_4_ * auVar233._24_4_ +
               local_300 * auVar161._24_4_ + local_4e0 * auVar206._24_4_) *
               (fVar155 + fVar155 * auVar193._24_4_);
  auVar227._0_4_ = fVar130 + (float)local_6c0._4_4_ * fVar117;
  auVar227._4_4_ = fVar130 + (float)local_6c0._4_4_ * fVar127;
  auVar227._8_4_ = fVar130 + (float)local_6c0._4_4_ * fStack_5f8;
  auVar227._12_4_ = fVar130 + (float)local_6c0._4_4_ * fStack_5f4;
  auVar227._16_4_ = fVar130 + (float)local_6c0._4_4_ * fStack_5f0;
  auVar227._20_4_ = fVar130 + (float)local_6c0._4_4_ * fStack_5ec;
  auVar227._24_4_ = fVar130 + (float)local_6c0._4_4_ * fStack_5e8;
  auVar227._28_4_ = fVar130 + fVar116;
  auVar136._0_4_ = fVar214 + local_300 * fVar117;
  auVar136._4_4_ = fVar214 + local_300 * fVar127;
  auVar136._8_4_ = fVar214 + local_300 * fStack_5f8;
  auVar136._12_4_ = fVar214 + local_300 * fStack_5f4;
  auVar136._16_4_ = fVar214 + local_300 * fStack_5f0;
  auVar136._20_4_ = fVar214 + local_300 * fStack_5ec;
  auVar136._24_4_ = fVar214 + local_300 * fStack_5e8;
  auVar136._28_4_ = fVar214 + fVar116;
  local_600 = (Primitive *)CONCAT44(fVar127,fVar117);
  auVar217._0_4_ = fVar219 + local_4e0 * fVar117;
  auVar217._4_4_ = fVar219 + local_4e0 * fVar127;
  auVar217._8_4_ = fVar219 + local_4e0 * fStack_5f8;
  auVar217._12_4_ = fVar219 + local_4e0 * fStack_5f4;
  auVar217._16_4_ = fVar219 + local_4e0 * fStack_5f0;
  auVar217._20_4_ = fVar219 + local_4e0 * fStack_5ec;
  auVar217._24_4_ = fVar219 + local_4e0 * fStack_5e8;
  auVar217._28_4_ = fVar219 + fVar116;
  local_540 = vsubps_avx(auVar246,auVar256);
  local_500 = vsubps_avx(auVar181,auVar158);
  fVar214 = local_500._0_4_;
  fVar143 = local_500._4_4_;
  fVar15 = local_500._8_4_;
  fVar20 = local_500._12_4_;
  fVar25 = local_500._16_4_;
  fVar30 = local_500._20_4_;
  fVar35 = local_500._24_4_;
  fVar219 = local_540._0_4_;
  fVar145 = local_540._4_4_;
  fVar16 = local_540._8_4_;
  fVar21 = local_540._12_4_;
  fVar26 = local_540._16_4_;
  fVar31 = local_540._20_4_;
  fVar36 = local_540._24_4_;
  local_660 = vsubps_avx(_local_5a0,auVar226);
  fVar116 = local_660._0_4_;
  fVar154 = local_660._4_4_;
  fVar17 = local_660._8_4_;
  fVar22 = local_660._12_4_;
  fVar27 = local_660._16_4_;
  fVar32 = local_660._20_4_;
  fVar37 = local_660._24_4_;
  local_360._0_4_ = fVar116 * fVar116 + fVar219 * fVar219 + fVar214 * fVar214;
  local_360._4_4_ = fVar154 * fVar154 + fVar145 * fVar145 + fVar143 * fVar143;
  fStack_358 = fVar17 * fVar17 + fVar16 * fVar16 + fVar15 * fVar15;
  fStack_354 = fVar22 * fVar22 + fVar21 * fVar21 + fVar20 * fVar20;
  fStack_350 = fVar27 * fVar27 + fVar26 * fVar26 + fVar25 * fVar25;
  fStack_34c = fVar32 * fVar32 + fVar31 * fVar31 + fVar30 * fVar30;
  fStack_348 = fVar37 * fVar37 + fVar36 * fVar36 + fVar35 * fVar35;
  fVar255 = fVar130 + fVar130 + fStack_5e4;
  _local_5c0 = vsubps_avx(auVar136,auVar256);
  local_520 = vsubps_avx(auVar217,auVar158);
  fVar213 = local_520._0_4_;
  fVar218 = local_520._4_4_;
  fVar220 = local_520._8_4_;
  fVar221 = local_520._12_4_;
  fVar222 = local_520._16_4_;
  fVar223 = local_520._20_4_;
  fVar224 = local_520._24_4_;
  fVar150 = local_5c0._0_4_;
  fVar155 = local_5c0._4_4_;
  fVar18 = local_5c0._8_4_;
  fVar23 = local_5c0._12_4_;
  fVar28 = local_5c0._16_4_;
  fVar33 = local_5c0._20_4_;
  fVar38 = local_5c0._24_4_;
  fVar128 = fVar130 + fVar130 + fStack_5e4;
  _local_460 = vsubps_avx(auVar227,auVar226);
  fVar129 = local_460._0_4_;
  fVar14 = local_460._4_4_;
  fVar19 = local_460._8_4_;
  fVar24 = local_460._12_4_;
  fVar29 = local_460._16_4_;
  fVar34 = local_460._20_4_;
  fVar39 = local_460._24_4_;
  fVar230 = fVar116 * fVar129 + fVar219 * fVar150 + fVar213 * fVar214;
  fVar235 = fVar154 * fVar14 + fVar145 * fVar155 + fVar218 * fVar143;
  fVar236 = fVar17 * fVar19 + fVar16 * fVar18 + fVar220 * fVar15;
  fVar237 = fVar22 * fVar24 + fVar21 * fVar23 + fVar221 * fVar20;
  fVar238 = fVar27 * fVar29 + fVar26 * fVar28 + fVar222 * fVar25;
  fVar239 = fVar32 * fVar34 + fVar31 * fVar33 + fVar223 * fVar30;
  fVar240 = fVar37 * fVar39 + fVar36 * fVar38 + fVar224 * fVar35;
  fVar241 = fVar130 + fVar128;
  fVar128 = fVar130 + fVar128;
  auVar228._0_4_ = (float)local_6c0._4_4_ * fVar116 + local_300 * fVar219 + local_4e0 * fVar214;
  auVar228._4_4_ = (float)local_6c0._4_4_ * fVar154 + local_300 * fVar145 + local_4e0 * fVar143;
  auVar228._8_4_ = (float)local_6c0._4_4_ * fVar17 + local_300 * fVar16 + local_4e0 * fVar15;
  auVar228._12_4_ = (float)local_6c0._4_4_ * fVar22 + local_300 * fVar21 + local_4e0 * fVar20;
  auVar228._16_4_ = (float)local_6c0._4_4_ * fVar27 + local_300 * fVar26 + local_4e0 * fVar25;
  auVar228._20_4_ = (float)local_6c0._4_4_ * fVar32 + local_300 * fVar31 + local_4e0 * fVar30;
  auVar228._24_4_ = (float)local_6c0._4_4_ * fVar37 + local_300 * fVar36 + local_4e0 * fVar35;
  auVar228._28_4_ = fVar130 + fVar128;
  local_6c0._0_4_ = local_6c0._4_4_;
  fStack_6b8 = (float)local_6c0._4_4_;
  fStack_6b4 = (float)local_6c0._4_4_;
  uStack_6b0._0_4_ = (float)local_6c0._4_4_;
  uStack_6b0._4_4_ = (float)local_6c0._4_4_;
  uStack_6a8._0_4_ = (float)local_6c0._4_4_;
  uStack_6a8._4_4_ = local_6c0._4_4_;
  auVar161 = vsubps_avx(_local_640,auVar92);
  fVar105 = auVar161._0_4_;
  fVar107 = auVar161._4_4_;
  fVar109 = auVar161._8_4_;
  fVar111 = auVar161._12_4_;
  fVar113 = auVar161._16_4_;
  fVar115 = auVar161._20_4_;
  fVar40 = auVar161._24_4_;
  fVar90 = (float)local_360._0_4_ + fVar105 * fVar105;
  fVar104 = (float)local_360._4_4_ + fVar107 * fVar107;
  fVar106 = fStack_358 + fVar109 * fVar109;
  fVar108 = fStack_354 + fVar111 * fVar111;
  fVar110 = fStack_350 + fVar113 * fVar113;
  fVar112 = fStack_34c + fVar115 * fVar115;
  fVar114 = fStack_348 + fVar40 * fVar40;
  fVar156 = (float)local_360._0_4_ * (float)local_360._0_4_;
  fVar163 = (float)local_360._4_4_ * (float)local_360._4_4_;
  local_240._4_4_ = fVar163;
  local_240._0_4_ = fVar156;
  fVar164 = fStack_358 * fStack_358;
  fStack_238 = fVar164;
  fVar165 = fStack_354 * fStack_354;
  fStack_234 = fVar165;
  fVar166 = fStack_350 * fStack_350;
  fStack_230 = fVar166;
  fVar167 = fStack_34c * fStack_34c;
  fStack_22c = fVar167;
  fVar168 = fStack_348 * fStack_348;
  fStack_228 = fVar168;
  uStack_224 = auVar158._28_4_;
  auVar242._4_4_ =
       fVar163 * ((float)local_6c0._4_4_ * fVar14 + local_300 * fVar155 + local_4e0 * fVar218);
  auVar242._0_4_ =
       fVar156 * ((float)local_6c0._4_4_ * fVar129 + local_300 * fVar150 + local_4e0 * fVar213);
  auVar242._8_4_ =
       fVar164 * ((float)local_6c0._4_4_ * fVar19 + local_300 * fVar18 + local_4e0 * fVar220);
  auVar242._12_4_ =
       fVar165 * ((float)local_6c0._4_4_ * fVar24 + local_300 * fVar23 + local_4e0 * fVar221);
  auVar242._16_4_ =
       fVar166 * ((float)local_6c0._4_4_ * fVar29 + local_300 * fVar28 + local_4e0 * fVar222);
  auVar242._20_4_ =
       fVar167 * ((float)local_6c0._4_4_ * fVar34 + local_300 * fVar33 + local_4e0 * fVar223);
  auVar242._24_4_ =
       fVar168 * ((float)local_6c0._4_4_ * fVar39 + local_300 * fVar38 + local_4e0 * fVar224);
  auVar242._28_4_ = fVar130 + fVar130 + fVar128;
  fVar128 = local_500._28_4_;
  auVar247._4_4_ = fVar104 * auVar228._4_4_ * fVar235;
  auVar247._0_4_ = fVar90 * auVar228._0_4_ * fVar230;
  auVar247._8_4_ = fVar106 * auVar228._8_4_ * fVar236;
  auVar247._12_4_ = fVar108 * auVar228._12_4_ * fVar237;
  auVar247._16_4_ = fVar110 * auVar228._16_4_ * fVar238;
  auVar247._20_4_ = fVar112 * auVar228._20_4_ * fVar239;
  auVar247._24_4_ = fVar114 * auVar228._24_4_ * fVar240;
  auVar247._28_4_ = fVar128;
  auVar193 = vsubps_avx(auVar242,auVar247);
  fStack_344 = fVar255;
  fVar188 = (float)local_360._0_4_ * fVar169;
  fVar196 = (float)local_360._4_4_ * fVar174;
  auVar257._4_4_ = fVar196;
  auVar257._0_4_ = fVar188;
  fVar197 = fStack_358 * fVar175;
  auVar257._8_4_ = fVar197;
  fVar198 = fStack_354 * fVar176;
  auVar257._12_4_ = fVar198;
  fVar199 = fStack_350 * fVar177;
  auVar257._16_4_ = fVar199;
  fVar200 = fStack_34c * fVar178;
  auVar257._20_4_ = fVar200;
  fVar201 = fStack_348 * fVar179;
  auVar257._24_4_ = fVar201;
  auVar257._28_4_ = fVar128;
  auVar119._0_4_ = auVar228._0_4_ * fVar105 * fVar188 + auVar193._0_4_;
  auVar119._4_4_ = auVar228._4_4_ * fVar107 * fVar196 + auVar193._4_4_;
  auVar119._8_4_ = auVar228._8_4_ * fVar109 * fVar197 + auVar193._8_4_;
  auVar119._12_4_ = auVar228._12_4_ * fVar111 * fVar198 + auVar193._12_4_;
  auVar119._16_4_ = auVar228._16_4_ * fVar113 * fVar199 + auVar193._16_4_;
  auVar119._20_4_ = auVar228._20_4_ * fVar115 * fVar200 + auVar193._20_4_;
  auVar119._24_4_ = auVar228._24_4_ * fVar40 * fVar201 + auVar193._24_4_;
  auVar119._28_4_ = (float)local_6c0._4_4_ + auVar193._28_4_;
  auVar47._4_4_ = fVar163 * (fVar14 * fVar14 + fVar155 * fVar155 + fVar218 * fVar218);
  auVar47._0_4_ = fVar156 * (fVar129 * fVar129 + fVar150 * fVar150 + fVar213 * fVar213);
  auVar47._8_4_ = fVar164 * (fVar19 * fVar19 + fVar18 * fVar18 + fVar220 * fVar220);
  auVar47._12_4_ = fVar165 * (fVar24 * fVar24 + fVar23 * fVar23 + fVar221 * fVar221);
  auVar47._16_4_ = fVar166 * (fVar29 * fVar29 + fVar28 * fVar28 + fVar222 * fVar222);
  auVar47._20_4_ = fVar167 * (fVar34 * fVar34 + fVar33 * fVar33 + fVar223 * fVar223);
  auVar47._24_4_ = fVar168 * (fVar39 * fVar39 + fVar38 * fVar38 + fVar224 * fVar224);
  auVar47._28_4_ = auVar158._28_4_ + auVar158._28_4_ + fVar130;
  auVar48._4_4_ = fVar235 * fVar235 * fVar104;
  auVar48._0_4_ = fVar230 * fVar230 * fVar90;
  auVar48._8_4_ = fVar236 * fVar236 * fVar106;
  auVar48._12_4_ = fVar237 * fVar237 * fVar108;
  auVar48._16_4_ = fVar238 * fVar238 * fVar110;
  auVar48._20_4_ = fVar239 * fVar239 * fVar112;
  auVar48._24_4_ = fVar240 * fVar240 * fVar114;
  auVar48._28_4_ = local_6c0._4_4_;
  auVar193 = vsubps_avx(auVar47,auVar48);
  auVar43._4_4_ = (fVar107 + fVar107) * fVar235;
  auVar43._0_4_ = (fVar105 + fVar105) * fVar230;
  auVar43._8_4_ = (fVar109 + fVar109) * fVar236;
  auVar43._12_4_ = (fVar111 + fVar111) * fVar237;
  auVar43._16_4_ = (fVar113 + fVar113) * fVar238;
  auVar43._20_4_ = (fVar115 + fVar115) * fVar239;
  auVar43._24_4_ = (fVar40 + fVar40) * fVar240;
  auVar43._28_4_ = auVar161._28_4_ + auVar161._28_4_;
  auVar161 = vsubps_avx(auVar43,auVar257);
  fVar130 = auVar228._0_4_ * auVar228._0_4_;
  fVar142 = auVar228._4_4_ * auVar228._4_4_;
  fVar144 = auVar228._8_4_ * auVar228._8_4_;
  fVar146 = auVar228._12_4_ * auVar228._12_4_;
  fVar147 = auVar228._16_4_ * auVar228._16_4_;
  fVar148 = auVar228._20_4_ * auVar228._20_4_;
  fVar149 = auVar228._24_4_ * auVar228._24_4_;
  auVar44._4_4_ = fVar104 * fVar142;
  auVar44._0_4_ = fVar90 * fVar130;
  auVar44._8_4_ = fVar106 * fVar144;
  auVar44._12_4_ = fVar108 * fVar146;
  auVar44._16_4_ = fVar110 * fVar147;
  auVar44._20_4_ = fVar112 * fVar148;
  auVar44._24_4_ = fVar114 * fVar149;
  auVar44._28_4_ = fVar128;
  auVar206 = vsubps_avx(_local_240,auVar44);
  auVar45._4_4_ = auVar206._4_4_ * (auVar193._4_4_ + auVar161._4_4_ * fVar196);
  auVar45._0_4_ = auVar206._0_4_ * (auVar193._0_4_ + auVar161._0_4_ * fVar188);
  auVar45._8_4_ = auVar206._8_4_ * (auVar193._8_4_ + auVar161._8_4_ * fVar197);
  auVar45._12_4_ = auVar206._12_4_ * (auVar193._12_4_ + auVar161._12_4_ * fVar198);
  auVar45._16_4_ = auVar206._16_4_ * (auVar193._16_4_ + auVar161._16_4_ * fVar199);
  auVar45._20_4_ = auVar206._20_4_ * (auVar193._20_4_ + auVar161._20_4_ * fVar200);
  auVar45._24_4_ = auVar206._24_4_ * (auVar193._24_4_ + auVar161._24_4_ * fVar201);
  auVar45._28_4_ = auVar193._28_4_ + fVar128;
  auVar46._4_4_ = auVar119._4_4_ * auVar119._4_4_;
  auVar46._0_4_ = auVar119._0_4_ * auVar119._0_4_;
  auVar46._8_4_ = auVar119._8_4_ * auVar119._8_4_;
  auVar46._12_4_ = auVar119._12_4_ * auVar119._12_4_;
  auVar46._16_4_ = auVar119._16_4_ * auVar119._16_4_;
  auVar46._20_4_ = auVar119._20_4_ * auVar119._20_4_;
  auVar46._24_4_ = auVar119._24_4_ * auVar119._24_4_;
  auVar46._28_4_ = fVar128;
  auVar193 = vsubps_avx(auVar46,auVar45);
  uVar84 = (ulong)((line->leftExists & 0xf) << 4);
  auVar161 = vcmpps_avx(auVar193,ZEXT432(0) << 0x20,5);
  auVar233 = auVar161 & ~auVar93;
  if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar233 >> 0x7f,0) != '\0') ||
        (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar233 >> 0xbf,0) != '\0') ||
      (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar233[0x1f] < '\0')
  {
    auVar233 = vandnps_avx(auVar93,auVar161);
    auVar257 = vsubps_avx(auVar227,_local_5a0);
    auVar47 = vsubps_avx(auVar136,auVar246);
    auVar48 = vsubps_avx(auVar217,auVar181);
    fVar244 = auVar257._0_4_ * fVar116 + fVar219 * auVar47._0_4_ + auVar48._0_4_ * fVar214;
    fVar249 = auVar257._4_4_ * fVar154 + fVar145 * auVar47._4_4_ + auVar48._4_4_ * fVar143;
    fVar250 = auVar257._8_4_ * fVar17 + fVar16 * auVar47._8_4_ + auVar48._8_4_ * fVar15;
    fVar251 = auVar257._12_4_ * fVar22 + fVar21 * auVar47._12_4_ + auVar48._12_4_ * fVar20;
    fVar252 = auVar257._16_4_ * fVar27 + fVar26 * auVar47._16_4_ + auVar48._16_4_ * fVar25;
    fVar253 = auVar257._20_4_ * fVar32 + fVar31 * auVar47._20_4_ + auVar48._20_4_ * fVar30;
    fVar254 = auVar257._24_4_ * fVar37 + fVar36 * auVar47._24_4_ + auVar48._24_4_ * fVar35;
    auVar193 = vsqrtps_avx(auVar193);
    auVar242 = vrcpps_avx(auVar206);
    fVar188 = auVar242._0_4_;
    auVar182._0_4_ = auVar206._0_4_ * fVar188;
    fVar196 = auVar242._4_4_;
    auVar182._4_4_ = auVar206._4_4_ * fVar196;
    fVar197 = auVar242._8_4_;
    auVar182._8_4_ = auVar206._8_4_ * fVar197;
    fVar198 = auVar242._12_4_;
    auVar182._12_4_ = auVar206._12_4_ * fVar198;
    fVar199 = auVar242._16_4_;
    auVar182._16_4_ = auVar206._16_4_ * fVar199;
    fVar200 = auVar242._20_4_;
    auVar182._20_4_ = auVar206._20_4_ * fVar200;
    fVar201 = auVar242._24_4_;
    auVar182._24_4_ = auVar206._24_4_ * fVar201;
    auVar182._28_4_ = 0;
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = &DAT_3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar94._16_4_ = 0x3f800000;
    auVar94._20_4_ = 0x3f800000;
    auVar94._24_4_ = 0x3f800000;
    auVar94._28_4_ = 0x3f800000;
    auVar247 = vsubps_avx(auVar94,auVar182);
    fStack_2d4 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + uVar84 + 8) >> 0x20);
    auVar191._8_4_ = 0x7fffffff;
    auVar191._0_8_ = 0x7fffffff7fffffff;
    auVar191._12_4_ = 0x7fffffff;
    auVar191._16_4_ = 0x7fffffff;
    auVar191._20_4_ = 0x7fffffff;
    auVar191._24_4_ = 0x7fffffff;
    auVar191._28_4_ = 0x7fffffff;
    fVar188 = fVar188 + fVar188 * auVar247._0_4_;
    fVar196 = fVar196 + fVar196 * auVar247._4_4_;
    fVar197 = fVar197 + fVar197 * auVar247._8_4_;
    fVar198 = fVar198 + fVar198 * auVar247._12_4_;
    fVar199 = fVar199 + fVar199 * auVar247._16_4_;
    fVar200 = fVar200 + fVar200 * auVar247._20_4_;
    fVar201 = fVar201 + fVar201 * auVar247._24_4_;
    auVar161 = vandps_avx(auVar206,auVar191);
    auVar203._8_4_ = 0x219392ef;
    auVar203._0_8_ = 0x219392ef219392ef;
    auVar203._12_4_ = 0x219392ef;
    auVar203._16_4_ = 0x219392ef;
    auVar203._20_4_ = 0x219392ef;
    auVar203._24_4_ = 0x219392ef;
    auVar203._28_4_ = 0x219392ef;
    auVar161 = vcmpps_avx(auVar161,auVar203,2);
    uVar88 = CONCAT44(auVar119._4_4_,auVar119._0_4_);
    auVar204._0_8_ = uVar88 ^ 0x8000000080000000;
    auVar204._8_4_ = -auVar119._8_4_;
    auVar204._12_4_ = -auVar119._12_4_;
    auVar204._16_4_ = -auVar119._16_4_;
    auVar204._20_4_ = -auVar119._20_4_;
    auVar204._24_4_ = -auVar119._24_4_;
    auVar204._28_4_ = -auVar119._28_4_;
    auVar206 = vsubps_avx(auVar204,auVar193);
    auVar43 = vsubps_avx(auVar193,auVar119);
    auVar49._4_4_ = auVar206._4_4_ * fVar196;
    auVar49._0_4_ = auVar206._0_4_ * fVar188;
    auVar49._8_4_ = auVar206._8_4_ * fVar197;
    auVar49._12_4_ = auVar206._12_4_ * fVar198;
    auVar49._16_4_ = auVar206._16_4_ * fVar199;
    auVar49._20_4_ = auVar206._20_4_ * fVar200;
    auVar49._24_4_ = auVar206._24_4_ * fVar201;
    auVar49._28_4_ = auVar193._28_4_;
    auVar50._4_4_ = auVar43._4_4_ * fVar196;
    auVar50._0_4_ = auVar43._0_4_ * fVar188;
    auVar50._8_4_ = auVar43._8_4_ * fVar197;
    auVar50._12_4_ = auVar43._12_4_ * fVar198;
    auVar50._16_4_ = auVar43._16_4_ * fVar199;
    auVar50._20_4_ = auVar43._20_4_ * fVar200;
    auVar50._24_4_ = auVar43._24_4_ * fVar201;
    auVar50._28_4_ = auVar43._28_4_;
    auVar95._8_4_ = 0xff800000;
    auVar95._0_8_ = 0xff800000ff800000;
    auVar95._12_4_ = 0xff800000;
    auVar95._16_4_ = 0xff800000;
    auVar95._20_4_ = 0xff800000;
    auVar95._24_4_ = 0xff800000;
    auVar95._28_4_ = 0xff800000;
    auVar193 = vblendvps_avx(auVar49,auVar95,auVar161);
    auVar159._8_4_ = 0x7f800000;
    auVar159._0_8_ = 0x7f8000007f800000;
    auVar159._12_4_ = 0x7f800000;
    auVar159._16_4_ = 0x7f800000;
    auVar159._20_4_ = 0x7f800000;
    auVar159._24_4_ = 0x7f800000;
    auVar159._28_4_ = 0x7f800000;
    auVar206 = vblendvps_avx(auVar50,auVar159,auVar161);
    auVar192._0_4_ = fVar230 + auVar228._0_4_ * auVar193._0_4_;
    auVar192._4_4_ = fVar235 + auVar228._4_4_ * auVar193._4_4_;
    auVar192._8_4_ = fVar236 + auVar228._8_4_ * auVar193._8_4_;
    auVar192._12_4_ = fVar237 + auVar228._12_4_ * auVar193._12_4_;
    auVar192._16_4_ = fVar238 + auVar228._16_4_ * auVar193._16_4_;
    auVar192._20_4_ = fVar239 + auVar228._20_4_ * auVar193._20_4_;
    auVar192._24_4_ = fVar240 + auVar228._24_4_ * auVar193._24_4_;
    auVar192._28_4_ = fVar241 + auVar242._28_4_ + auVar247._28_4_;
    auVar161 = vcmpps_avx(auVar192,ZEXT832(0) << 0x20,6);
    auVar242 = vcmpps_avx(auVar192,_local_360,1);
    auVar161 = vandps_avx(auVar242,auVar161);
    auVar161 = vandps_avx(auVar233,auVar161);
    _local_5a0 = vblendvps_avx(auVar159,auVar193,auVar161);
    local_380._0_4_ = fVar230 + auVar228._0_4_ * auVar206._0_4_;
    local_380._4_4_ = fVar235 + auVar228._4_4_ * auVar206._4_4_;
    fStack_378 = fVar236 + auVar228._8_4_ * auVar206._8_4_;
    fStack_374 = fVar237 + auVar228._12_4_ * auVar206._12_4_;
    fStack_370 = fVar238 + auVar228._16_4_ * auVar206._16_4_;
    fStack_36c = fVar239 + auVar228._20_4_ * auVar206._20_4_;
    fStack_368 = fVar240 + auVar228._24_4_ * auVar206._24_4_;
    register0x0000139c = fVar241 + local_5a0._28_4_;
    auVar161 = vcmpps_avx(_local_380,ZEXT832(0) << 0x20,6);
    auVar193 = vcmpps_avx(_local_380,_local_360,1);
    auVar161 = vandps_avx(auVar193,auVar161);
    auVar161 = vandps_avx(auVar233,auVar161);
    _local_640 = vblendvps_avx(auVar95,auVar206,auVar161);
    auVar247 = vrcpps_avx(auVar228);
    fVar188 = auVar247._0_4_;
    fVar196 = auVar247._4_4_;
    auVar51._4_4_ = auVar228._4_4_ * fVar196;
    auVar51._0_4_ = auVar228._0_4_ * fVar188;
    fVar197 = auVar247._8_4_;
    auVar51._8_4_ = auVar228._8_4_ * fVar197;
    fVar198 = auVar247._12_4_;
    auVar51._12_4_ = auVar228._12_4_ * fVar198;
    fVar199 = auVar247._16_4_;
    auVar51._16_4_ = auVar228._16_4_ * fVar199;
    fVar200 = auVar247._20_4_;
    auVar51._20_4_ = auVar228._20_4_ * fVar200;
    fVar201 = auVar247._24_4_;
    auVar51._24_4_ = auVar228._24_4_ * fVar201;
    auVar51._28_4_ = auVar161._28_4_;
    auVar183._8_4_ = 0x3f800000;
    auVar183._0_8_ = &DAT_3f8000003f800000;
    auVar183._12_4_ = 0x3f800000;
    auVar183._16_4_ = 0x3f800000;
    auVar183._20_4_ = 0x3f800000;
    auVar183._24_4_ = 0x3f800000;
    auVar183._28_4_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar183,auVar51);
    fVar188 = fVar188 + fVar188 * auVar43._0_4_;
    fVar196 = fVar196 + fVar196 * auVar43._4_4_;
    fVar197 = fVar197 + fVar197 * auVar43._8_4_;
    fVar198 = fVar198 + fVar198 * auVar43._12_4_;
    fVar199 = fVar199 + fVar199 * auVar43._16_4_;
    fVar200 = fVar200 + fVar200 * auVar43._20_4_;
    fVar201 = fVar201 + fVar201 * auVar43._24_4_;
    auVar52._4_4_ = auVar228._4_4_ * fVar14;
    auVar52._0_4_ = auVar228._0_4_ * fVar129;
    auVar52._8_4_ = auVar228._8_4_ * fVar19;
    auVar52._12_4_ = auVar228._12_4_ * fVar24;
    auVar52._16_4_ = auVar228._16_4_ * fVar29;
    auVar52._20_4_ = auVar228._20_4_ * fVar34;
    auVar52._24_4_ = auVar228._24_4_ * fVar39;
    auVar52._28_4_ = auVar43._28_4_;
    auVar53._4_4_ = (float)local_6c0._4_4_ * fVar235;
    auVar53._0_4_ = (float)local_6c0._4_4_ * fVar230;
    auVar53._8_4_ = (float)local_6c0._4_4_ * fVar236;
    auVar53._12_4_ = (float)local_6c0._4_4_ * fVar237;
    auVar53._16_4_ = (float)local_6c0._4_4_ * fVar238;
    auVar53._20_4_ = (float)local_6c0._4_4_ * fVar239;
    auVar53._24_4_ = (float)local_6c0._4_4_ * fVar240;
    auVar53._28_4_ = 0x3f800000;
    auVar161 = vsubps_avx(auVar52,auVar53);
    auVar54._4_4_ = auVar228._4_4_ * fVar155;
    auVar54._0_4_ = auVar228._0_4_ * fVar150;
    auVar54._8_4_ = auVar228._8_4_ * fVar18;
    auVar54._12_4_ = auVar228._12_4_ * fVar23;
    auVar54._16_4_ = auVar228._16_4_ * fVar28;
    auVar54._20_4_ = auVar228._20_4_ * fVar33;
    auVar54._24_4_ = auVar228._24_4_ * fVar38;
    auVar54._28_4_ = 0x3f800000;
    auVar55._4_4_ = fVar235 * local_300;
    auVar55._0_4_ = fVar230 * local_300;
    auVar55._8_4_ = fVar236 * local_300;
    auVar55._12_4_ = fVar237 * local_300;
    auVar55._16_4_ = fVar238 * local_300;
    auVar55._20_4_ = fVar239 * local_300;
    auVar55._24_4_ = fVar240 * local_300;
    auVar55._28_4_ = auVar242._28_4_;
    auVar193 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = auVar228._4_4_ * fVar218;
    auVar56._0_4_ = auVar228._0_4_ * fVar213;
    auVar56._8_4_ = auVar228._8_4_ * fVar220;
    auVar56._12_4_ = auVar228._12_4_ * fVar221;
    auVar56._16_4_ = auVar228._16_4_ * fVar222;
    auVar56._20_4_ = auVar228._20_4_ * fVar223;
    auVar56._24_4_ = auVar228._24_4_ * fVar224;
    auVar56._28_4_ = auVar242._28_4_;
    auVar211._0_4_ = local_4e0 * fVar230;
    auVar211._4_4_ = local_4e0 * fVar235;
    auVar211._8_4_ = local_4e0 * fVar236;
    auVar211._12_4_ = local_4e0 * fVar237;
    auVar211._16_4_ = local_4e0 * fVar238;
    auVar211._20_4_ = local_4e0 * fVar239;
    auVar211._24_4_ = local_4e0 * fVar240;
    auVar211._28_4_ = 0;
    auVar206 = vsubps_avx(auVar56,auVar211);
    fVar57 = auVar206._28_4_;
    fVar187 = auVar193._28_4_ + fVar57;
    auVar137._0_4_ =
         auVar161._0_4_ * auVar161._0_4_ +
         auVar193._0_4_ * auVar193._0_4_ + auVar206._0_4_ * auVar206._0_4_;
    auVar137._4_4_ =
         auVar161._4_4_ * auVar161._4_4_ +
         auVar193._4_4_ * auVar193._4_4_ + auVar206._4_4_ * auVar206._4_4_;
    auVar137._8_4_ =
         auVar161._8_4_ * auVar161._8_4_ +
         auVar193._8_4_ * auVar193._8_4_ + auVar206._8_4_ * auVar206._8_4_;
    auVar137._12_4_ =
         auVar161._12_4_ * auVar161._12_4_ +
         auVar193._12_4_ * auVar193._12_4_ + auVar206._12_4_ * auVar206._12_4_;
    auVar137._16_4_ =
         auVar161._16_4_ * auVar161._16_4_ +
         auVar193._16_4_ * auVar193._16_4_ + auVar206._16_4_ * auVar206._16_4_;
    auVar137._20_4_ =
         auVar161._20_4_ * auVar161._20_4_ +
         auVar193._20_4_ * auVar193._20_4_ + auVar206._20_4_ * auVar206._20_4_;
    auVar137._24_4_ =
         auVar161._24_4_ * auVar161._24_4_ +
         auVar193._24_4_ * auVar193._24_4_ + auVar206._24_4_ * auVar206._24_4_;
    auVar137._28_4_ = auVar161._28_4_ + fVar187;
    auVar58._4_4_ = fVar142 * fVar174 * fVar174;
    auVar58._0_4_ = fVar130 * fVar169 * fVar169;
    auVar58._8_4_ = fVar144 * fVar175 * fVar175;
    auVar58._12_4_ = fVar146 * fVar176 * fVar176;
    auVar58._16_4_ = fVar147 * fVar177 * fVar177;
    auVar58._20_4_ = fVar148 * fVar178 * fVar178;
    auVar58._24_4_ = fVar149 * fVar179 * fVar179;
    auVar58._28_4_ = fVar187;
    auVar161 = vcmpps_avx(auVar137,auVar58,1);
    auVar59._4_4_ = fVar196 * -fVar235;
    auVar59._0_4_ = fVar188 * -fVar230;
    auVar59._8_4_ = fVar197 * -fVar236;
    auVar59._12_4_ = fVar198 * -fVar237;
    auVar59._16_4_ = fVar199 * -fVar238;
    auVar59._20_4_ = fVar200 * -fVar239;
    auVar59._24_4_ = fVar201 * -fVar240;
    auVar59._28_4_ = -fVar241;
    auVar193 = vblendvps_avx(auVar159,auVar59,auVar161);
    auVar184._12_4_ = fStack_2d4;
    auVar184._0_12_ = *(undefined1 (*) [12])(mm_lookupmask_ps + uVar84);
    auVar184._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar161 = vandnps_avx(auVar184,auVar233);
    auVar206 = vblendvps_avx(auVar159,auVar193,auVar161);
    auVar138._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar138._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar60._4_4_ = auVar228._4_4_ * auVar257._4_4_;
    auVar60._0_4_ = auVar228._0_4_ * auVar257._0_4_;
    auVar60._8_4_ = auVar228._8_4_ * auVar257._8_4_;
    auVar60._12_4_ = auVar228._12_4_ * auVar257._12_4_;
    auVar60._16_4_ = auVar228._16_4_ * auVar257._16_4_;
    auVar60._20_4_ = auVar228._20_4_ * auVar257._20_4_;
    auVar60._24_4_ = auVar228._24_4_ * auVar257._24_4_;
    auVar60._28_4_ = 0;
    auVar61._4_4_ = auVar228._4_4_ * auVar47._4_4_;
    auVar61._0_4_ = auVar228._0_4_ * auVar47._0_4_;
    auVar61._8_4_ = auVar228._8_4_ * auVar47._8_4_;
    auVar61._12_4_ = auVar228._12_4_ * auVar47._12_4_;
    auVar61._16_4_ = auVar228._16_4_ * auVar47._16_4_;
    auVar61._20_4_ = auVar228._20_4_ * auVar47._20_4_;
    auVar61._24_4_ = auVar228._24_4_ * auVar47._24_4_;
    auVar61._28_4_ = auVar161._28_4_;
    auVar62._4_4_ = auVar228._4_4_ * auVar48._4_4_;
    auVar62._0_4_ = auVar228._0_4_ * auVar48._0_4_;
    auVar62._8_4_ = auVar228._8_4_ * auVar48._8_4_;
    auVar62._12_4_ = auVar228._12_4_ * auVar48._12_4_;
    auVar62._16_4_ = auVar228._16_4_ * auVar48._16_4_;
    auVar62._20_4_ = auVar228._20_4_ * auVar48._20_4_;
    auVar62._24_4_ = auVar228._24_4_ * auVar48._24_4_;
    auVar62._28_4_ = 0;
    auVar63._4_4_ = (float)local_6c0._4_4_ * fVar249;
    auVar63._0_4_ = (float)local_6c0._4_4_ * fVar244;
    auVar63._8_4_ = (float)local_6c0._4_4_ * fVar250;
    auVar63._12_4_ = (float)local_6c0._4_4_ * fVar251;
    auVar63._16_4_ = (float)local_6c0._4_4_ * fVar252;
    auVar63._20_4_ = (float)local_6c0._4_4_ * fVar253;
    auVar63._24_4_ = (float)local_6c0._4_4_ * fVar254;
    auVar63._28_4_ = fVar57;
    auVar161 = vsubps_avx(auVar60,auVar63);
    auVar64._4_4_ = fVar249 * local_300;
    auVar64._0_4_ = fVar244 * local_300;
    auVar64._8_4_ = fVar250 * local_300;
    auVar64._12_4_ = fVar251 * local_300;
    auVar64._16_4_ = fVar252 * local_300;
    auVar64._20_4_ = fVar253 * local_300;
    auVar64._24_4_ = fVar254 * local_300;
    auVar64._28_4_ = fVar57;
    auVar193 = vsubps_avx(auVar61,auVar64);
    auVar65._4_4_ = local_4e0 * fVar249;
    auVar65._0_4_ = local_4e0 * fVar244;
    auVar65._8_4_ = local_4e0 * fVar250;
    auVar65._12_4_ = local_4e0 * fVar251;
    auVar65._16_4_ = local_4e0 * fVar252;
    auVar65._20_4_ = local_4e0 * fVar253;
    auVar65._24_4_ = local_4e0 * fVar254;
    auVar65._28_4_ = fVar57;
    auVar242 = vsubps_avx(auVar62,auVar65);
    auVar96._0_4_ =
         auVar161._0_4_ * auVar161._0_4_ +
         auVar193._0_4_ * auVar193._0_4_ + auVar242._0_4_ * auVar242._0_4_;
    auVar96._4_4_ =
         auVar161._4_4_ * auVar161._4_4_ +
         auVar193._4_4_ * auVar193._4_4_ + auVar242._4_4_ * auVar242._4_4_;
    auVar96._8_4_ =
         auVar161._8_4_ * auVar161._8_4_ +
         auVar193._8_4_ * auVar193._8_4_ + auVar242._8_4_ * auVar242._8_4_;
    auVar96._12_4_ =
         auVar161._12_4_ * auVar161._12_4_ +
         auVar193._12_4_ * auVar193._12_4_ + auVar242._12_4_ * auVar242._12_4_;
    auVar96._16_4_ =
         auVar161._16_4_ * auVar161._16_4_ +
         auVar193._16_4_ * auVar193._16_4_ + auVar242._16_4_ * auVar242._16_4_;
    auVar96._20_4_ =
         auVar161._20_4_ * auVar161._20_4_ +
         auVar193._20_4_ * auVar193._20_4_ + auVar242._20_4_ * auVar242._20_4_;
    auVar96._24_4_ =
         auVar161._24_4_ * auVar161._24_4_ +
         auVar193._24_4_ * auVar193._24_4_ + auVar242._24_4_ * auVar242._24_4_;
    auVar96._28_4_ = auVar161._28_4_ + auVar193._28_4_ + auVar242._28_4_;
    auVar66._4_4_ = fVar142 * auVar91._4_4_ * auVar91._4_4_;
    auVar66._0_4_ = fVar130 * auVar91._0_4_ * auVar91._0_4_;
    auVar66._8_4_ = fVar144 * auVar91._8_4_ * auVar91._8_4_;
    auVar66._12_4_ = fVar146 * auVar91._12_4_ * auVar91._12_4_;
    auVar66._16_4_ = fVar147 * auVar92._16_4_ * auVar92._16_4_;
    auVar66._20_4_ = fVar148 * auVar92._20_4_ * auVar92._20_4_;
    auVar66._24_4_ = fVar149 * auVar92._24_4_ * auVar92._24_4_;
    auVar66._28_4_ = auVar92._28_4_;
    auVar193 = vcmpps_avx(auVar96,auVar66,1);
    auVar41 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x60)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0);
    auVar161 = vandnps_avx(auVar138,auVar233);
    auVar67._4_4_ = fVar196 * -fVar249;
    auVar67._0_4_ = fVar188 * -fVar244;
    auVar67._8_4_ = fVar197 * -fVar250;
    auVar67._12_4_ = fVar198 * -fVar251;
    auVar67._16_4_ = fVar199 * -fVar252;
    auVar67._20_4_ = fVar200 * -fVar253;
    auVar67._24_4_ = fVar201 * -fVar254;
    auVar67._28_4_ = auVar247._28_4_ + auVar43._28_4_;
    auVar193 = vblendvps_avx(auVar159,auVar67,auVar193);
    auVar161 = vblendvps_avx(auVar159,auVar193,auVar161);
    auVar242 = vmaxps_avx(auVar206,auVar161);
    auVar193 = vcmpps_avx(auVar159,auVar242,0);
    auVar172._8_4_ = 0xff800000;
    auVar172._0_8_ = 0xff800000ff800000;
    auVar172._12_4_ = 0xff800000;
    auVar172._16_4_ = 0xff800000;
    auVar172._20_4_ = 0xff800000;
    auVar172._24_4_ = 0xff800000;
    auVar172._28_4_ = 0xff800000;
    auVar193 = vblendvps_avx(auVar242,auVar172,auVar193);
    auVar242 = vminps_avx(auVar206,auVar161);
    auVar161 = vcmpps_avx(auVar159,auVar242,0);
    auVar161 = vblendvps_avx(auVar242,auVar172,auVar161);
    auVar247 = vminps_avx(_local_5a0,auVar242);
    auVar242 = vcmpps_avx(auVar247,auVar242,0);
    auVar161 = vblendvps_avx(auVar161,auVar193,auVar242);
    auVar139._16_16_ = auVar41;
    auVar139._0_16_ = auVar41;
    local_2c0 = vmaxps_avx(_local_640,auVar161);
    auVar120._0_4_ = fVar117 + auVar247._0_4_;
    auVar120._4_4_ = fVar127 + auVar247._4_4_;
    auVar120._8_4_ = fStack_5f8 + auVar247._8_4_;
    auVar120._12_4_ = fStack_5f4 + auVar247._12_4_;
    auVar120._16_4_ = fStack_5f0 + auVar247._16_4_;
    auVar120._20_4_ = fStack_5ec + auVar247._20_4_;
    auVar120._24_4_ = fStack_5e8 + auVar247._24_4_;
    auVar120._28_4_ = fStack_5e4 + auVar247._28_4_;
    auVar161 = vcmpps_avx(auVar139,auVar120,2);
    auVar41 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x100)),0);
    auVar152._16_16_ = auVar41;
    auVar152._0_16_ = auVar41;
    auVar193 = vcmpps_avx(auVar120,auVar152,2);
    auVar161 = vandps_avx(auVar193,auVar161);
    auVar193 = vcmpps_avx(auVar159,auVar247,4);
    auVar193 = vandps_avx(auVar233,auVar193);
    local_480 = vandps_avx(auVar161,auVar193);
    local_680._0_4_ = fVar117 + local_2c0._0_4_;
    local_680._4_4_ = fVar127 + local_2c0._4_4_;
    fStack_678 = fStack_5f8 + local_2c0._8_4_;
    fStack_674 = fStack_5f4 + local_2c0._12_4_;
    fStack_670 = fStack_5f0 + local_2c0._16_4_;
    fStack_66c = fStack_5ec + local_2c0._20_4_;
    fStack_668 = fStack_5e8 + local_2c0._24_4_;
    fStack_84 = local_2c0._28_4_;
    register0x0000135c = fStack_5e4 + fStack_84;
    auVar161 = vcmpps_avx(auVar139,_local_680,2);
    auVar193 = vcmpps_avx(_local_680,auVar152,2);
    auVar161 = vandps_avx(auVar193,auVar161);
    auVar193 = vcmpps_avx(auVar172,local_2c0,4);
    auVar193 = vandps_avx(auVar233,auVar193);
    local_4a0 = vandps_avx(auVar161,auVar193);
    local_620 = vorps_avx(local_480,local_4a0);
    if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_620 >> 0x7f,0) != '\0') ||
          (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_620 >> 0xbf,0) != '\0') ||
        (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_620[0x1f] < '\0') {
      auVar242 = vblendvps_avx(local_2c0,auVar247,local_480);
      auVar247 = vblendvps_avx(_local_380,auVar192,local_480);
      auVar161 = vrcpps_avx(_local_360);
      local_560 = auVar161._0_4_;
      fStack_55c = auVar161._4_4_;
      auVar68._4_4_ = (float)local_360._4_4_ * fStack_55c;
      auVar68._0_4_ = (float)local_360._0_4_ * local_560;
      fStack_558 = auVar161._8_4_;
      auVar68._8_4_ = fStack_358 * fStack_558;
      fStack_554 = auVar161._12_4_;
      auVar68._12_4_ = fStack_354 * fStack_554;
      fStack_550 = auVar161._16_4_;
      auVar68._16_4_ = fStack_350 * fStack_550;
      fStack_54c = auVar161._20_4_;
      auVar68._20_4_ = fStack_34c * fStack_54c;
      fStack_548 = auVar161._24_4_;
      auVar68._24_4_ = fStack_348 * fStack_548;
      auVar68._28_4_ = local_480._28_4_;
      auVar153._8_4_ = 0x3f800000;
      auVar153._0_8_ = &DAT_3f8000003f800000;
      auVar153._12_4_ = 0x3f800000;
      auVar153._16_4_ = 0x3f800000;
      auVar153._20_4_ = 0x3f800000;
      auVar153._24_4_ = 0x3f800000;
      auVar153._28_4_ = 0x3f800000;
      auVar193 = vsubps_avx(auVar153,auVar68);
      local_560 = local_560 + local_560 * auVar193._0_4_;
      fStack_55c = fStack_55c + fStack_55c * auVar193._4_4_;
      fStack_558 = fStack_558 + fStack_558 * auVar193._8_4_;
      fStack_554 = fStack_554 + fStack_554 * auVar193._12_4_;
      fStack_550 = fStack_550 + fStack_550 * auVar193._16_4_;
      fStack_54c = fStack_54c + fStack_54c * auVar193._20_4_;
      fStack_548 = fStack_548 + fStack_548 * auVar193._24_4_;
      fStack_544 = auVar161._28_4_ + auVar193._28_4_;
      fVar169 = (float)local_360._0_4_ * fVar105 * fVar169;
      fVar174 = (float)local_360._4_4_ * fVar107 * fVar174;
      fVar175 = fStack_358 * fVar109 * fVar175;
      fVar176 = fStack_354 * fVar111 * fVar176;
      fVar177 = fStack_350 * fVar113 * fVar177;
      fVar178 = fStack_34c * fVar115 * fVar178;
      fVar179 = fStack_348 * fVar40 * fVar179;
      fStack_2fc = local_300;
      fStack_2f8 = local_300;
      fStack_2f4 = local_300;
      fStack_2f0 = local_300;
      fStack_2ec = local_300;
      fStack_2e8 = local_300;
      fStack_2e4 = local_300;
      auVar161 = vcmpps_avx(auVar242,_local_5a0,0);
      auVar193 = vcmpps_avx(_local_640,auVar242,0);
      auVar161 = vorps_avx(auVar161,auVar193);
      auVar161 = vandps_avx(auVar233,auVar161);
      _local_360 = auVar206;
      auVar257 = vcmpps_avx(auVar206,auVar242,0);
      auVar193 = vandps_avx(auVar233,auVar257);
      fVar130 = auVar242._0_4_;
      fVar105 = auVar242._4_4_;
      fVar107 = auVar242._8_4_;
      fVar109 = auVar242._12_4_;
      fVar111 = auVar242._16_4_;
      fVar113 = auVar242._20_4_;
      fVar115 = auVar242._24_4_;
      local_2e0 = fVar116 * fVar169;
      fStack_2dc = fVar154 * fVar174;
      fStack_2d8 = fVar17 * fVar175;
      fStack_2d4 = fVar22 * fVar176;
      fStack_2d0 = fVar27 * fVar177;
      fStack_2cc = fVar32 * fVar178;
      fStack_2c8 = fVar37 * fVar179;
      fStack_2c4 = -INFINITY;
      auVar140._0_4_ = fVar116 * fVar169 + fVar156 * (fVar130 * (float)local_6c0._4_4_ + fVar129);
      auVar140._4_4_ = fVar154 * fVar174 + fVar163 * (fVar105 * (float)local_6c0._4_4_ + fVar14);
      auVar140._8_4_ = fVar17 * fVar175 + fVar164 * (fVar107 * (float)local_6c0._4_4_ + fVar19);
      auVar140._12_4_ = fVar22 * fVar176 + fVar165 * (fVar109 * (float)local_6c0._4_4_ + fVar24);
      auVar140._16_4_ = fVar27 * fVar177 + fVar166 * (fVar111 * (float)local_6c0._4_4_ + fVar29);
      auVar140._20_4_ = fVar32 * fVar178 + fVar167 * (fVar113 * (float)local_6c0._4_4_ + fVar34);
      auVar140._24_4_ = fVar37 * fVar179 + fVar168 * (fVar115 * (float)local_6c0._4_4_ + fVar39);
      auVar140._28_4_ = auVar257._28_4_ + fStack_444 + -INFINITY;
      local_80 = fVar116 * fVar90;
      fStack_7c = fVar154 * fVar104;
      fStack_78 = fVar17 * fVar106;
      fStack_74 = fVar22 * fVar108;
      fStack_70 = fVar27 * fVar110;
      fStack_6c = fVar32 * fVar112;
      fStack_68 = fVar37 * fVar114;
      fStack_64 = local_300;
      local_4c0._0_4_ = auVar247._0_4_;
      local_4c0._4_4_ = auVar247._4_4_;
      fStack_4b8 = auVar247._8_4_;
      fStack_4b4 = auVar247._12_4_;
      fStack_4b0 = auVar247._16_4_;
      fStack_4ac = auVar247._20_4_;
      fStack_4a8 = auVar247._24_4_;
      auVar69._4_4_ = fVar154 * fVar104 * (float)local_4c0._4_4_;
      auVar69._0_4_ = fVar116 * fVar90 * (float)local_4c0._0_4_;
      auVar69._8_4_ = fVar17 * fVar106 * fStack_4b8;
      auVar69._12_4_ = fVar22 * fVar108 * fStack_4b4;
      auVar69._16_4_ = fVar27 * fVar110 * fStack_4b0;
      auVar69._20_4_ = fVar32 * fVar112 * fStack_4ac;
      auVar69._24_4_ = fVar37 * fVar114 * fStack_4a8;
      auVar69._28_4_ = 0xff800000;
      auVar233 = vsubps_avx(auVar140,auVar69);
      fStack_31c = fVar145 * fVar174;
      local_320 = fVar219 * fVar169;
      fStack_318 = fVar16 * fVar175;
      fStack_314 = fVar21 * fVar176;
      fStack_310 = fVar26 * fVar177;
      fStack_30c = fVar31 * fVar178;
      fStack_308 = fVar36 * fVar179;
      fStack_304 = INFINITY;
      auVar205._0_4_ = fVar219 * fVar169 + fVar156 * (local_300 * fVar130 + fVar150);
      auVar205._4_4_ = fVar145 * fVar174 + fVar163 * (local_300 * fVar105 + fVar155);
      auVar205._8_4_ = fVar16 * fVar175 + fVar164 * (local_300 * fVar107 + fVar18);
      auVar205._12_4_ = fVar21 * fVar176 + fVar165 * (local_300 * fVar109 + fVar23);
      auVar205._16_4_ = fVar26 * fVar177 + fVar166 * (local_300 * fVar111 + fVar28);
      auVar205._20_4_ = fVar31 * fVar178 + fVar167 * (local_300 * fVar113 + fVar33);
      auVar205._24_4_ = fVar36 * fVar179 + fVar168 * (local_300 * fVar115 + fVar38);
      auVar205._28_4_ = uStack_5a8._4_4_ + -INFINITY + INFINITY;
      fStack_29c = fVar145 * fVar104;
      local_2a0 = fVar219 * fVar90;
      fStack_298 = fVar16 * fVar106;
      fStack_294 = fVar21 * fVar108;
      fStack_290 = fVar26 * fVar110;
      fStack_28c = fVar31 * fVar112;
      fStack_288 = fVar36 * fVar114;
      uStack_284 = auVar206._28_4_;
      auVar70._4_4_ = fVar145 * fVar104 * (float)local_4c0._4_4_;
      auVar70._0_4_ = fVar219 * fVar90 * (float)local_4c0._0_4_;
      auVar70._8_4_ = fVar16 * fVar106 * fStack_4b8;
      auVar70._12_4_ = fVar21 * fVar108 * fStack_4b4;
      auVar70._16_4_ = fVar26 * fVar110 * fStack_4b0;
      auVar70._20_4_ = fVar31 * fVar112 * fStack_4ac;
      auVar70._24_4_ = fVar36 * fVar114 * fStack_4a8;
      auVar70._28_4_ = local_640._28_4_;
      auVar247 = vsubps_avx(auVar205,auVar70);
      local_c0._0_8_ = local_660._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar17;
      local_c0._12_4_ = -fVar22;
      local_c0._16_4_ = -fVar27;
      local_c0._20_4_ = -fVar32;
      local_c0._24_4_ = -fVar37;
      local_c0._28_4_ = -local_660._28_4_;
      auVar206 = vblendvps_avx(local_660,local_c0,auVar193);
      local_3e0 = vblendvps_avx(auVar206,auVar233,auVar161);
      auVar258 = ZEXT3264(local_500);
      local_a0 = fVar214 * fVar169;
      fStack_9c = fVar143 * fVar174;
      fStack_98 = fVar15 * fVar175;
      fStack_94 = fVar20 * fVar176;
      fStack_90 = fVar25 * fVar177;
      fStack_8c = fVar30 * fVar178;
      fStack_88 = fVar35 * fVar179;
      auVar160._0_4_ = fVar214 * fVar169 + fVar156 * (fVar213 + local_4e0 * fVar130);
      auVar160._4_4_ = fVar143 * fVar174 + fVar163 * (fVar218 + local_4e0 * fVar105);
      auVar160._8_4_ = fVar15 * fVar175 + fVar164 * (fVar220 + local_4e0 * fVar107);
      auVar160._12_4_ = fVar20 * fVar176 + fVar165 * (fVar221 + local_4e0 * fVar109);
      auVar160._16_4_ = fVar25 * fVar177 + fVar166 * (fVar222 + local_4e0 * fVar111);
      auVar160._20_4_ = fVar30 * fVar178 + fVar167 * (fVar223 + local_4e0 * fVar113);
      auVar160._24_4_ = fVar35 * fVar179 + fVar168 * (fVar224 + local_4e0 * fVar115);
      auVar160._28_4_ = fStack_84 + local_520._28_4_ + local_c0._28_4_;
      local_280 = fVar214 * fVar90;
      fStack_27c = fVar143 * fVar104;
      fStack_278 = fVar15 * fVar106;
      fStack_274 = fVar20 * fVar108;
      fStack_270 = fVar25 * fVar110;
      fStack_26c = fVar30 * fVar112;
      fStack_268 = fVar35 * fVar114;
      fStack_264 = fVar255 + auVar158._28_4_;
      auVar71._4_4_ = (float)local_4c0._4_4_ * fVar143 * fVar104;
      auVar71._0_4_ = (float)local_4c0._0_4_ * fVar214 * fVar90;
      auVar71._8_4_ = fStack_4b8 * fVar15 * fVar106;
      auVar71._12_4_ = fStack_4b4 * fVar20 * fVar108;
      auVar71._16_4_ = fStack_4b0 * fVar25 * fVar110;
      auVar71._20_4_ = fStack_4ac * fVar30 * fVar112;
      auVar71._24_4_ = fStack_4a8 * fVar35 * fVar114;
      auVar71._28_4_ = fStack_84;
      local_e0._0_8_ = local_540._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar16;
      local_e0._12_4_ = -fVar21;
      local_e0._16_4_ = -fVar26;
      local_e0._20_4_ = -fVar31;
      local_e0._24_4_ = -fVar36;
      local_e0._28_4_ = local_540._28_4_ ^ 0x80000000;
      auVar206 = vblendvps_avx(local_540,local_e0,auVar193);
      auVar233 = vsubps_avx(auVar160,auVar71);
      local_3c0 = vblendvps_avx(auVar206,auVar247,auVar161);
      local_100._0_8_ = local_500._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar15;
      local_100._12_4_ = -fVar20;
      local_100._16_4_ = -fVar25;
      local_100._20_4_ = -fVar30;
      local_100._24_4_ = -fVar35;
      local_100._28_4_ = -fVar128;
      auVar206 = vblendvps_avx(local_500,local_100,auVar193);
      local_3a0 = vblendvps_avx(auVar206,auVar233,auVar161);
      auVar121._8_4_ = 0x3f800000;
      auVar121._0_8_ = &DAT_3f8000003f800000;
      auVar121._12_4_ = 0x3f800000;
      auVar121._16_4_ = 0x3f800000;
      auVar121._20_4_ = 0x3f800000;
      auVar121._24_4_ = 0x3f800000;
      auVar121._28_4_ = 0x3f800000;
      auVar193 = vblendvps_avx(auVar121,ZEXT832(0) << 0x20,auVar193);
      auVar72._4_4_ = (float)local_4c0._4_4_ * fStack_55c;
      auVar72._0_4_ = (float)local_4c0._0_4_ * local_560;
      auVar72._8_4_ = fStack_4b8 * fStack_558;
      auVar72._12_4_ = fStack_4b4 * fStack_554;
      auVar72._16_4_ = fStack_4b0 * fStack_550;
      auVar72._20_4_ = fStack_4ac * fStack_54c;
      auVar72._24_4_ = fStack_4a8 * fStack_548;
      auVar72._28_4_ = 0x3f800000;
      local_440 = vblendvps_avx(auVar193,auVar72,auVar161);
      local_400._0_4_ = fVar130 + fVar117;
      local_400._4_4_ = fVar105 + fVar127;
      local_400._8_4_ = fVar107 + fStack_5f8;
      local_400._12_4_ = fVar109 + fStack_5f4;
      local_400._16_4_ = fVar111 + fStack_5f0;
      local_400._20_4_ = fVar113 + fStack_5ec;
      local_400._24_4_ = fVar115 + fStack_5e8;
      local_400._28_4_ = auVar242._28_4_ + fStack_5e4;
      auVar186 = ZEXT3264(local_400);
      local_420 = ZEXT832(0) << 0x20;
      auVar97._8_4_ = 0x7f800000;
      auVar97._0_8_ = 0x7f8000007f800000;
      auVar97._12_4_ = 0x7f800000;
      auVar97._16_4_ = 0x7f800000;
      auVar97._20_4_ = 0x7f800000;
      auVar97._24_4_ = 0x7f800000;
      auVar97._28_4_ = 0x7f800000;
      auVar161 = vblendvps_avx(auVar97,local_400,local_620);
      auVar206 = vshufps_avx(auVar161,auVar161,0xb1);
      auVar206 = vminps_avx(auVar161,auVar206);
      auVar233 = vshufpd_avx(auVar206,auVar206,5);
      auVar206 = vminps_avx(auVar206,auVar233);
      auVar233 = vperm2f128_avx(auVar206,auVar206,1);
      auVar206 = vminps_avx(auVar206,auVar233);
      auVar206 = vcmpps_avx(auVar161,auVar206,0);
      auVar233 = local_620 & auVar206;
      auVar195 = ZEXT3264(_local_6c0);
      auVar208 = ZEXT3264(CONCAT428(local_300,
                                    CONCAT424(local_300,
                                              CONCAT420(local_300,
                                                        CONCAT416(local_300,
                                                                  CONCAT412(local_300,
                                                                            CONCAT48(local_300,
                                                                                     CONCAT44(
                                                  local_300,local_300))))))));
      auVar212 = ZEXT3264(CONCAT428(local_4e0,
                                    CONCAT424(local_4e0,
                                              CONCAT420(local_4e0,
                                                        CONCAT416(local_4e0,
                                                                  CONCAT412(local_4e0,
                                                                            CONCAT48(local_4e0,
                                                                                     CONCAT44(
                                                  local_4e0,local_4e0))))))));
      auVar234 = ZEXT3264(local_540);
      auVar243 = ZEXT3264(_local_5c0);
      auVar248 = ZEXT3264(local_520);
      auVar161 = local_620;
      if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar233 >> 0x7f,0) != '\0') ||
            (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar233 >> 0xbf,0) != '\0') ||
          (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar233[0x1f] < '\0') {
        auVar161 = vandps_avx(auVar206,local_620);
      }
      uVar82 = vmovmskps_avx(auVar161);
      uVar83 = 0;
      if (uVar82 != 0) {
        for (; (uVar82 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
        }
      }
      uVar82 = 1 << ((byte)k & 0x1f);
      uVar84 = (ulong)((uVar82 & 0xf) << 4);
      lVar89 = (long)((int)uVar82 >> 4) * 0x10;
      auVar161 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar173 = ZEXT3264(auVar161);
      auVar229 = ZEXT864(0) << 0x20;
      auVar162 = ZEXT3264(local_660);
      local_5e0 = local_620;
      local_568 = k;
      fStack_4dc = local_4e0;
      fStack_4d8 = local_4e0;
      fStack_4d4 = local_4e0;
      fStack_4d0 = local_4e0;
      fStack_4cc = local_4e0;
      fStack_4c8 = local_4e0;
      fStack_4c4 = local_4e0;
      _local_4c0 = auVar193;
      do {
        auVar206 = auVar208._0_32_;
        auVar193 = auVar195._0_32_;
        auVar247 = auVar248._0_32_;
        auVar242 = auVar243._0_32_;
        auVar209 = auVar212._0_28_;
        auVar257 = auVar258._0_32_;
        auVar233 = auVar234._0_32_;
        auVar161 = auVar162._0_32_;
        uVar88 = (ulong)uVar83;
        uVar83 = *(uint *)(local_260 + uVar88 * 4);
        pGVar10 = (pSVar9->geometries).items[uVar83].ptr;
        local_6f0.ray = (RTCRayN *)ray;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_620 + uVar88 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar131 = *(undefined4 *)(local_440 + uVar88 * 4);
            uVar2 = *(undefined4 *)(local_420 + uVar88 * 4);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar88 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_3e0 + uVar88 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_3c0 + uVar88 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_3a0 + uVar88 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar131;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar88];
            *(uint *)(ray + k * 4 + 0x240) = uVar83;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_011caa3e:
            auVar47 = vandps_avx(local_4a0,local_480);
            uVar131 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar124._4_4_ = uVar131;
            auVar124._0_4_ = uVar131;
            auVar124._8_4_ = uVar131;
            auVar124._12_4_ = uVar131;
            auVar124._16_4_ = uVar131;
            auVar124._20_4_ = uVar131;
            auVar124._24_4_ = uVar131;
            auVar124._28_4_ = uVar131;
            auVar48 = vcmpps_avx(_local_680,auVar124,2);
            auVar43 = auVar47 & auVar48;
            if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar43 >> 0x7f,0) == '\0') &&
                  (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar43 >> 0xbf,0) == '\0') &&
                (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar43[0x1f]) {
              return;
            }
            auVar43 = vcmpps_avx(local_2c0,_local_360,0);
            auVar161 = vblendvps_avx(auVar161,local_c0,auVar43);
            auVar233 = vblendvps_avx(auVar233,local_e0,auVar43);
            auVar257 = vblendvps_avx(auVar257,local_100,auVar43);
            auVar43 = vcmpps_avx(local_2c0,_local_5a0,0);
            auVar44 = vcmpps_avx(local_2c0,_local_640,0);
            auVar43 = vorps_avx(auVar43,auVar44);
            fVar214 = local_2c0._0_4_;
            fVar219 = local_2c0._4_4_;
            fVar130 = local_2c0._8_4_;
            fVar116 = local_2c0._12_4_;
            fVar150 = local_2c0._16_4_;
            fVar129 = local_2c0._20_4_;
            fVar105 = local_2c0._24_4_;
            auVar185._0_4_ =
                 (float)local_240._0_4_ * (fVar214 * auVar193._0_4_ + (float)local_460._0_4_) +
                 local_2e0;
            auVar185._4_4_ =
                 (float)local_240._4_4_ * (fVar219 * auVar193._4_4_ + (float)local_460._4_4_) +
                 fStack_2dc;
            auVar185._8_4_ = fStack_238 * (fVar130 * auVar193._8_4_ + fStack_458) + fStack_2d8;
            auVar185._12_4_ = fStack_234 * (fVar116 * auVar193._12_4_ + fStack_454) + fStack_2d4;
            auVar185._16_4_ = fStack_230 * (fVar150 * auVar193._16_4_ + fStack_450) + fStack_2d0;
            auVar185._20_4_ = fStack_22c * (fVar129 * auVar193._20_4_ + fStack_44c) + fStack_2cc;
            auVar185._24_4_ = fStack_228 * (fVar105 * auVar193._24_4_ + fStack_448) + fStack_2c8;
            auVar185._28_4_ = auVar44._28_4_ + fStack_444 + fStack_2c4;
            auVar194._0_4_ =
                 (float)local_240._0_4_ * (auVar242._0_4_ + auVar206._0_4_ * fVar214) + local_320;
            auVar194._4_4_ =
                 (float)local_240._4_4_ * (auVar242._4_4_ + auVar206._4_4_ * fVar219) + fStack_31c;
            auVar194._8_4_ = fStack_238 * (auVar242._8_4_ + auVar206._8_4_ * fVar130) + fStack_318;
            auVar194._12_4_ =
                 fStack_234 * (auVar242._12_4_ + auVar206._12_4_ * fVar116) + fStack_314;
            auVar194._16_4_ =
                 fStack_230 * (auVar242._16_4_ + auVar206._16_4_ * fVar150) + fStack_310;
            auVar194._20_4_ =
                 fStack_22c * (auVar242._20_4_ + auVar206._20_4_ * fVar129) + fStack_30c;
            auVar194._24_4_ =
                 fStack_228 * (auVar242._24_4_ + auVar206._24_4_ * fVar105) + fStack_308;
            auVar194._28_4_ = auVar242._28_4_ + auVar193._28_4_ + fStack_304;
            auVar207._0_4_ =
                 (float)local_240._0_4_ * (auVar247._0_4_ + auVar209._0_4_ * fVar214) + local_a0;
            auVar207._4_4_ =
                 (float)local_240._4_4_ * (auVar247._4_4_ + auVar209._4_4_ * fVar219) + fStack_9c;
            auVar207._8_4_ = fStack_238 * (auVar247._8_4_ + auVar209._8_4_ * fVar130) + fStack_98;
            auVar207._12_4_ = fStack_234 * (auVar247._12_4_ + auVar209._12_4_ * fVar116) + fStack_94
            ;
            auVar207._16_4_ = fStack_230 * (auVar247._16_4_ + auVar209._16_4_ * fVar150) + fStack_90
            ;
            auVar207._20_4_ = fStack_22c * (auVar247._20_4_ + auVar209._20_4_ * fVar129) + fStack_8c
            ;
            auVar207._24_4_ = fStack_228 * (auVar247._24_4_ + auVar209._24_4_ * fVar105) + fStack_88
            ;
            auVar207._28_4_ = auVar247._28_4_ + auVar206._28_4_ + fStack_84;
            auVar73._4_4_ = (float)local_380._4_4_ * fStack_7c;
            auVar73._0_4_ = (float)local_380._0_4_ * local_80;
            auVar73._8_4_ = fStack_378 * fStack_78;
            auVar73._12_4_ = fStack_374 * fStack_74;
            auVar73._16_4_ = fStack_370 * fStack_70;
            auVar73._20_4_ = fStack_36c * fStack_6c;
            auVar73._24_4_ = fStack_368 * fStack_68;
            auVar73._28_4_ = uStack_224;
            auVar193 = vsubps_avx(auVar185,auVar73);
            auVar74._4_4_ = (float)local_380._4_4_ * fStack_29c;
            auVar74._0_4_ = (float)local_380._0_4_ * local_2a0;
            auVar74._8_4_ = fStack_378 * fStack_298;
            auVar74._12_4_ = fStack_374 * fStack_294;
            auVar74._16_4_ = fStack_370 * fStack_290;
            auVar74._20_4_ = fStack_36c * fStack_28c;
            auVar74._24_4_ = fStack_368 * fStack_288;
            auVar74._28_4_ = uStack_224;
            auVar206 = vsubps_avx(auVar194,auVar74);
            auVar75._4_4_ = (float)local_380._4_4_ * fStack_27c;
            auVar75._0_4_ = (float)local_380._0_4_ * local_280;
            auVar75._8_4_ = fStack_378 * fStack_278;
            auVar75._12_4_ = fStack_374 * fStack_274;
            auVar75._16_4_ = fStack_370 * fStack_270;
            auVar75._20_4_ = fStack_36c * fStack_26c;
            auVar75._24_4_ = fStack_368 * fStack_268;
            auVar75._28_4_ = uStack_224;
            auVar242 = vsubps_avx(auVar207,auVar75);
            local_3e0 = vblendvps_avx(auVar161,auVar193,auVar43);
            local_3c0 = vblendvps_avx(auVar233,auVar206,auVar43);
            local_3a0 = vblendvps_avx(auVar257,auVar242,auVar43);
            auVar76._4_4_ = (float)local_380._4_4_ * fStack_55c;
            auVar76._0_4_ = (float)local_380._0_4_ * local_560;
            auVar76._8_4_ = fStack_378 * fStack_558;
            auVar76._12_4_ = fStack_374 * fStack_554;
            auVar76._16_4_ = fStack_370 * fStack_550;
            auVar76._20_4_ = fStack_36c * fStack_54c;
            auVar76._24_4_ = fStack_368 * fStack_548;
            auVar76._28_4_ = auVar193._28_4_;
            local_440 = vblendvps_avx(_local_4c0,auVar76,auVar43);
            local_620 = vandps_avx(auVar48,auVar47);
            local_420 = ZEXT832(0) << 0x20;
            local_400 = _local_680;
            auVar141._8_4_ = 0x7f800000;
            auVar141._0_8_ = 0x7f8000007f800000;
            auVar141._12_4_ = 0x7f800000;
            auVar141._16_4_ = 0x7f800000;
            auVar141._20_4_ = 0x7f800000;
            auVar141._24_4_ = 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar161 = vblendvps_avx(auVar141,_local_680,local_620);
            auVar193 = vshufps_avx(auVar161,auVar161,0xb1);
            auVar193 = vminps_avx(auVar161,auVar193);
            auVar206 = vshufpd_avx(auVar193,auVar193,5);
            auVar193 = vminps_avx(auVar193,auVar206);
            auVar206 = vperm2f128_avx(auVar193,auVar193,1);
            auVar193 = vminps_avx(auVar193,auVar206);
            auVar193 = vcmpps_avx(auVar161,auVar193,0);
            auVar87 = (undefined1  [8])context->scene;
            auVar206 = local_620 & auVar193;
            auVar161 = local_620;
            if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar206 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar206 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar206 >> 0x7f,0) != '\0') ||
                  (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar206 >> 0xbf,0) != '\0') ||
                (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar206[0x1f] < '\0') {
              auVar161 = vandps_avx(auVar193,local_620);
            }
            uVar82 = vmovmskps_avx(auVar161);
            uVar86 = 1 << ((byte)k & 0x1f);
            uVar83 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
              }
            }
            uVar84 = (ulong)((uVar86 & 0xf) << 4);
            lVar89 = (long)((int)uVar86 >> 4) * 0x10;
            auVar161 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar186 = ZEXT3264(auVar161);
            auVar195 = ZEXT864(0) << 0x20;
            do {
              uVar88 = (ulong)uVar83;
              uVar83 = *(uint *)(local_260 + uVar88 * 4);
              pGVar10 = (((Scene *)auVar87)->geometries).items[uVar83].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_620 + uVar88 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar131 = *(undefined4 *)(local_440 + uVar88 * 4);
                  uVar2 = *(undefined4 *)(local_420 + uVar88 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar88 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_3e0 + uVar88 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_3c0 + uVar88 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_3a0 + uVar88 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar131;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                  *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar88];
                  *(uint *)(ray + k * 4 + 0x240) = uVar83;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                local_1c0 = *(undefined4 *)(local_440 + uVar88 * 4);
                local_1a0 = *(undefined4 *)(local_420 + uVar88 * 4);
                local_180 = (line->primIDs).field_0.i[uVar88];
                uVar131 = *(undefined4 *)(local_3e0 + uVar88 * 4);
                local_220._4_4_ = uVar131;
                local_220._0_4_ = uVar131;
                local_220._8_4_ = uVar131;
                local_220._12_4_ = uVar131;
                local_220._16_4_ = uVar131;
                local_220._20_4_ = uVar131;
                local_220._24_4_ = uVar131;
                local_220._28_4_ = uVar131;
                uVar131 = *(undefined4 *)(local_3c0 + uVar88 * 4);
                local_200._4_4_ = uVar131;
                local_200._0_4_ = uVar131;
                local_200._8_4_ = uVar131;
                local_200._12_4_ = uVar131;
                local_200._16_4_ = uVar131;
                local_200._20_4_ = uVar131;
                local_200._24_4_ = uVar131;
                local_200._28_4_ = uVar131;
                auStack_150 = vpshufd_avx(ZEXT416(uVar83),0);
                uVar131 = *(undefined4 *)(local_3a0 + uVar88 * 4);
                local_1e0._4_4_ = uVar131;
                local_1e0._0_4_ = uVar131;
                local_1e0._8_4_ = uVar131;
                local_1e0._12_4_ = uVar131;
                local_1e0._16_4_ = uVar131;
                local_1e0._20_4_ = uVar131;
                local_1e0._24_4_ = uVar131;
                local_1e0._28_4_ = uVar131;
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = auStack_150;
                local_660 = auVar186._0_32_;
                uStack_13c = context->user->instID[0];
                local_140 = uStack_13c;
                uStack_138 = uStack_13c;
                uStack_134 = uStack_13c;
                uStack_130 = uStack_13c;
                uStack_12c = uStack_13c;
                uStack_128 = uStack_13c;
                uStack_124 = uStack_13c;
                uStack_11c = context->user->instPrimID[0];
                local_120 = uStack_11c;
                uStack_118 = uStack_11c;
                uStack_114 = uStack_11c;
                uStack_110 = uStack_11c;
                uStack_10c = uStack_11c;
                uStack_108 = uStack_11c;
                uStack_104 = uStack_11c;
                uVar131 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar88 * 4);
                local_6a0 = *(undefined8 *)(mm_lookupmask_ps + uVar84);
                uStack_698 = *(undefined8 *)(mm_lookupmask_ps + uVar84 + 8);
                local_690 = *(undefined8 *)(mm_lookupmask_ps + lVar89);
                uStack_688 = *(undefined8 *)(mm_lookupmask_ps + lVar89 + 8);
                local_6f0.valid = (int *)&local_6a0;
                local_6f0.geometryUserPtr = pGVar10->userPtr;
                local_6f0.context = context->user;
                local_6f0.hit = (RTCHitN *)local_220;
                local_6f0.N = 8;
                local_600 = line;
                local_6f0.ray = (RTCRayN *)ray;
                if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_640 = auVar87;
                  local_6c0._0_4_ = uVar131;
                  (*pGVar10->intersectionFilterN)(&local_6f0);
                  auVar195 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar186 = ZEXT3264(local_660);
                  auVar87 = local_640;
                  uVar131 = local_6c0._0_4_;
                }
                auVar77._8_8_ = uStack_698;
                auVar77._0_8_ = local_6a0;
                auVar41 = vpcmpeqd_avx(auVar195._0_16_,auVar77);
                auVar80._8_8_ = uStack_688;
                auVar80._0_8_ = local_690;
                auVar42 = vpcmpeqd_avx(auVar195._0_16_,auVar80);
                auVar101._16_16_ = auVar42;
                auVar101._0_16_ = auVar41;
                local_660 = auVar186._0_32_;
                auVar161 = local_660 & ~auVar101;
                if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar161 >> 0x7f,0) == '\0') &&
                      (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar161 >> 0xbf,0) == '\0') &&
                    (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar161[0x1f]) {
                  auVar102._0_4_ = auVar41._0_4_ ^ auVar186._0_4_;
                  auVar102._4_4_ = auVar41._4_4_ ^ auVar186._4_4_;
                  auVar102._8_4_ = auVar41._8_4_ ^ auVar186._8_4_;
                  auVar102._12_4_ = auVar41._12_4_ ^ auVar186._12_4_;
                  auVar102._16_4_ = auVar42._0_4_ ^ auVar186._16_4_;
                  auVar102._20_4_ = auVar42._4_4_ ^ auVar186._20_4_;
                  auVar102._24_4_ = auVar42._8_4_ ^ auVar186._24_4_;
                  auVar102._28_4_ = auVar42._12_4_ ^ auVar186._28_4_;
                  line = local_600;
                }
                else {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    local_640 = auVar87;
                    local_6c0._0_4_ = uVar131;
                    (*p_Var13)(&local_6f0);
                    auVar195 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar186 = ZEXT3264(local_660);
                    auVar87 = local_640;
                    uVar131 = local_6c0._0_4_;
                  }
                  auVar78._8_8_ = uStack_698;
                  auVar78._0_8_ = local_6a0;
                  auVar41 = vpcmpeqd_avx(auVar195._0_16_,auVar78);
                  auVar81._8_8_ = uStack_688;
                  auVar81._0_8_ = local_690;
                  auVar42 = vpcmpeqd_avx(auVar195._0_16_,auVar81);
                  auVar126._16_16_ = auVar42;
                  auVar126._0_16_ = auVar41;
                  auVar102._0_4_ = auVar41._0_4_ ^ auVar186._0_4_;
                  auVar102._4_4_ = auVar41._4_4_ ^ auVar186._4_4_;
                  auVar102._8_4_ = auVar41._8_4_ ^ auVar186._8_4_;
                  auVar102._12_4_ = auVar41._12_4_ ^ auVar186._12_4_;
                  auVar102._16_4_ = auVar42._0_4_ ^ auVar186._16_4_;
                  auVar102._20_4_ = auVar42._4_4_ ^ auVar186._20_4_;
                  auVar102._24_4_ = auVar42._8_4_ ^ auVar186._24_4_;
                  auVar102._28_4_ = auVar42._12_4_ ^ auVar186._28_4_;
                  auVar161 = auVar186._0_32_ & ~auVar126;
                  line = local_600;
                  if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar161 >> 0x7f,0) != '\0') ||
                        (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar161 >> 0xbf,0) != '\0') ||
                      (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar161[0x1f] < '\0') {
                    auVar161 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])local_6f0.hit);
                    *(undefined1 (*) [32])(local_6f0.ray + 0x180) = auVar161;
                    auVar161 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_6f0.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_6f0.ray + 0x1a0) = auVar161;
                    auVar161 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_6f0.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_6f0.ray + 0x1c0) = auVar161;
                    auVar161 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_6f0.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_6f0.ray + 0x1e0) = auVar161;
                    auVar161 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_6f0.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_6f0.ray + 0x200) = auVar161;
                    auVar161 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_6f0.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_6f0.ray + 0x220) = auVar161;
                    auVar161 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_6f0.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_6f0.ray + 0x240) = auVar161;
                    auVar161 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_6f0.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_6f0.ray + 0x260) = auVar161;
                    auVar161 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_6f0.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_6f0.ray + 0x280) = auVar161;
                  }
                }
                if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar102 >> 0x7f,0) == '\0') &&
                      (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar102 >> 0xbf,0) == '\0') &&
                    (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar102[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar131;
                }
                *(undefined4 *)(local_620 + uVar88 * 4) = 0;
                uVar131 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar103._4_4_ = uVar131;
                auVar103._0_4_ = uVar131;
                auVar103._8_4_ = uVar131;
                auVar103._12_4_ = uVar131;
                auVar103._16_4_ = uVar131;
                auVar103._20_4_ = uVar131;
                auVar103._24_4_ = uVar131;
                auVar103._28_4_ = uVar131;
                auVar161 = vcmpps_avx(_local_680,auVar103,2);
                local_620 = vandps_avx(auVar161,local_620);
              }
              if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_620 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_620 >> 0x7f,0) == '\0') &&
                    (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_620 >> 0xbf,0) == '\0') &&
                  (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_620[0x1f]) {
                return;
              }
              auVar125._8_4_ = 0x7f800000;
              auVar125._0_8_ = 0x7f8000007f800000;
              auVar125._12_4_ = 0x7f800000;
              auVar125._16_4_ = 0x7f800000;
              auVar125._20_4_ = 0x7f800000;
              auVar125._24_4_ = 0x7f800000;
              auVar125._28_4_ = 0x7f800000;
              auVar161 = vblendvps_avx(auVar125,_local_680,local_620);
              auVar193 = vshufps_avx(auVar161,auVar161,0xb1);
              auVar193 = vminps_avx(auVar161,auVar193);
              auVar206 = vshufpd_avx(auVar193,auVar193,5);
              auVar193 = vminps_avx(auVar193,auVar206);
              auVar206 = vperm2f128_avx(auVar193,auVar193,1);
              auVar193 = vminps_avx(auVar193,auVar206);
              auVar193 = vcmpps_avx(auVar161,auVar193,0);
              auVar206 = local_620 & auVar193;
              auVar161 = local_620;
              if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar206 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar206 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar206 >> 0x7f,0) != '\0') ||
                    (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar206 >> 0xbf,0) != '\0') ||
                  (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar206[0x1f] < '\0') {
                auVar161 = vandps_avx(auVar193,local_620);
              }
              uVar82 = vmovmskps_avx(auVar161);
              uVar83 = 0;
              if (uVar82 != 0) {
                for (; (uVar82 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
                }
              }
            } while( true );
          }
          local_1c0 = *(undefined4 *)(local_440 + uVar88 * 4);
          local_1a0 = *(undefined4 *)(local_420 + uVar88 * 4);
          local_180 = (line->primIDs).field_0.i[uVar88];
          local_220._4_4_ = *(undefined4 *)(local_3e0 + uVar88 * 4);
          local_5e0 = auVar173._0_32_;
          local_200._4_4_ = *(undefined4 *)(local_3c0 + uVar88 * 4);
          auStack_150 = vpshufd_avx(ZEXT416(uVar83),0);
          uVar131 = *(undefined4 *)(local_3a0 + uVar88 * 4);
          local_1e0._4_4_ = uVar131;
          local_1e0._0_4_ = uVar131;
          local_1e0._8_4_ = uVar131;
          local_1e0._12_4_ = uVar131;
          local_1e0._16_4_ = uVar131;
          local_1e0._20_4_ = uVar131;
          local_1e0._24_4_ = uVar131;
          local_1e0._28_4_ = uVar131;
          local_220._0_4_ = local_220._4_4_;
          local_220._8_4_ = local_220._4_4_;
          local_220._12_4_ = local_220._4_4_;
          local_220._16_4_ = local_220._4_4_;
          local_220._20_4_ = local_220._4_4_;
          local_220._24_4_ = local_220._4_4_;
          local_220._28_4_ = local_220._4_4_;
          local_200._0_4_ = local_200._4_4_;
          local_200._8_4_ = local_200._4_4_;
          local_200._12_4_ = local_200._4_4_;
          local_200._16_4_ = local_200._4_4_;
          local_200._20_4_ = local_200._4_4_;
          local_200._24_4_ = local_200._4_4_;
          local_200._28_4_ = local_200._4_4_;
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1b0 = local_1c0;
          uStack_1ac = local_1c0;
          uStack_1a8 = local_1c0;
          uStack_1a4 = local_1c0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          uStack_190 = local_1a0;
          uStack_18c = local_1a0;
          uStack_188 = local_1a0;
          uStack_184 = local_1a0;
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          local_160 = auStack_150;
          uStack_13c = context->user->instID[0];
          local_140 = uStack_13c;
          uStack_138 = uStack_13c;
          uStack_134 = uStack_13c;
          uStack_130 = uStack_13c;
          uStack_12c = uStack_13c;
          uStack_128 = uStack_13c;
          uStack_124 = uStack_13c;
          uStack_11c = context->user->instPrimID[0];
          local_120 = uStack_11c;
          uStack_118 = uStack_11c;
          uStack_114 = uStack_11c;
          uStack_110 = uStack_11c;
          uStack_10c = uStack_11c;
          uStack_108 = uStack_11c;
          uStack_104 = uStack_11c;
          uVar131 = *(undefined4 *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_400 + uVar88 * 4);
          local_6a0 = *(undefined8 *)(mm_lookupmask_ps + uVar84);
          uStack_698 = *(undefined8 *)(mm_lookupmask_ps + uVar84 + 8);
          local_690 = *(undefined8 *)(mm_lookupmask_ps + lVar89);
          uStack_688 = *(undefined8 *)(mm_lookupmask_ps + lVar89 + 8);
          local_6f0.valid = (int *)&local_6a0;
          local_6f0.geometryUserPtr = pGVar10->userPtr;
          local_6f0.context = context->user;
          local_6f0.hit = (RTCHitN *)local_220;
          local_6f0.N = 8;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_340 = auVar186._0_32_;
            local_600 = line;
            (*pGVar10->intersectionFilterN)(&local_6f0);
            auVar229 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar186 = ZEXT3264(local_340);
            auVar248 = ZEXT3264(local_520);
            auVar243 = ZEXT3264(_local_5c0);
            auVar258 = ZEXT3264(local_500);
            auVar234 = ZEXT3264(local_540);
            auVar212 = ZEXT3264(CONCAT428(fStack_4c4,
                                          CONCAT424(fStack_4c8,
                                                    CONCAT420(fStack_4cc,
                                                              CONCAT416(fStack_4d0,
                                                                        CONCAT412(fStack_4d4,
                                                                                  CONCAT48(
                                                  fStack_4d8,CONCAT44(fStack_4dc,local_4e0))))))));
            auVar208 = ZEXT3264(CONCAT428(fStack_2e4,
                                          CONCAT424(fStack_2e8,
                                                    CONCAT420(fStack_2ec,
                                                              CONCAT416(fStack_2f0,
                                                                        CONCAT412(fStack_2f4,
                                                                                  CONCAT48(
                                                  fStack_2f8,CONCAT44(fStack_2fc,local_300))))))));
            auVar195 = ZEXT3264(_local_6c0);
            line = local_600;
          }
          auVar173 = ZEXT3264(local_5e0);
          auVar41._8_8_ = uStack_698;
          auVar41._0_8_ = local_6a0;
          auVar41 = vpcmpeqd_avx(auVar229._0_16_,auVar41);
          auVar42._8_8_ = uStack_688;
          auVar42._0_8_ = local_690;
          auVar42 = vpcmpeqd_avx(auVar229._0_16_,auVar42);
          auVar98._16_16_ = auVar42;
          auVar98._0_16_ = auVar41;
          auVar161 = local_5e0 & ~auVar98;
          if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar161 >> 0x7f,0) == '\0') &&
                (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar161 >> 0xbf,0) == '\0') &&
              (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar161[0x1f]) {
            auVar99._0_4_ = auVar41._0_4_ ^ local_5e0._0_4_;
            auVar99._4_4_ = auVar41._4_4_ ^ local_5e0._4_4_;
            auVar99._8_4_ = auVar41._8_4_ ^ local_5e0._8_4_;
            auVar99._12_4_ = auVar41._12_4_ ^ local_5e0._12_4_;
            auVar99._16_4_ = auVar42._0_4_ ^ local_5e0._16_4_;
            auVar99._20_4_ = auVar42._4_4_ ^ local_5e0._20_4_;
            auVar99._24_4_ = auVar42._8_4_ ^ local_5e0._24_4_;
            auVar99._28_4_ = auVar42._12_4_ ^ local_5e0._28_4_;
            auVar162 = ZEXT3264(local_660);
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              local_340 = auVar186._0_32_;
              (*p_Var13)(&local_6f0);
              auVar229 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar173 = ZEXT3264(local_5e0);
              auVar186 = ZEXT3264(local_340);
              auVar248 = ZEXT3264(local_520);
              auVar243 = ZEXT3264(_local_5c0);
              auVar258 = ZEXT3264(local_500);
              auVar234 = ZEXT3264(local_540);
              auVar212 = ZEXT3264(CONCAT428(fStack_4c4,
                                            CONCAT424(fStack_4c8,
                                                      CONCAT420(fStack_4cc,
                                                                CONCAT416(fStack_4d0,
                                                                          CONCAT412(fStack_4d4,
                                                                                    CONCAT48(
                                                  fStack_4d8,CONCAT44(fStack_4dc,local_4e0))))))));
              auVar208 = ZEXT3264(CONCAT428(fStack_2e4,
                                            CONCAT424(fStack_2e8,
                                                      CONCAT420(fStack_2ec,
                                                                CONCAT416(fStack_2f0,
                                                                          CONCAT412(fStack_2f4,
                                                                                    CONCAT48(
                                                  fStack_2f8,CONCAT44(fStack_2fc,local_300))))))));
              auVar195 = ZEXT3264(_local_6c0);
            }
            auVar132._8_8_ = uStack_698;
            auVar132._0_8_ = local_6a0;
            auVar41 = vpcmpeqd_avx(auVar229._0_16_,auVar132);
            auVar79._8_8_ = uStack_688;
            auVar79._0_8_ = local_690;
            auVar42 = vpcmpeqd_avx(auVar229._0_16_,auVar79);
            auVar123._16_16_ = auVar42;
            auVar123._0_16_ = auVar41;
            auVar99._0_4_ = auVar41._0_4_ ^ auVar173._0_4_;
            auVar99._4_4_ = auVar41._4_4_ ^ auVar173._4_4_;
            auVar99._8_4_ = auVar41._8_4_ ^ auVar173._8_4_;
            auVar99._12_4_ = auVar41._12_4_ ^ auVar173._12_4_;
            auVar99._16_4_ = auVar42._0_4_ ^ auVar173._16_4_;
            auVar99._20_4_ = auVar42._4_4_ ^ auVar173._20_4_;
            auVar99._24_4_ = auVar42._8_4_ ^ auVar173._24_4_;
            auVar99._28_4_ = auVar42._12_4_ ^ auVar173._28_4_;
            auVar161 = auVar173._0_32_ & ~auVar123;
            auVar162 = ZEXT3264(local_660);
            if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar161 >> 0x7f,0) != '\0') ||
                  (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar161 >> 0xbf,0) != '\0') ||
                (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar161[0x1f] < '\0') {
              auVar161 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])local_6f0.hit);
              *(undefined1 (*) [32])(local_6f0.ray + 0x180) = auVar161;
              auVar161 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6f0.hit + 0x20));
              *(undefined1 (*) [32])(local_6f0.ray + 0x1a0) = auVar161;
              auVar161 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6f0.hit + 0x40));
              *(undefined1 (*) [32])(local_6f0.ray + 0x1c0) = auVar161;
              auVar161 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6f0.hit + 0x60));
              *(undefined1 (*) [32])(local_6f0.ray + 0x1e0) = auVar161;
              auVar161 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6f0.hit + 0x80));
              *(undefined1 (*) [32])(local_6f0.ray + 0x200) = auVar161;
              auVar161 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6f0.hit + 0xa0));
              *(undefined1 (*) [32])(local_6f0.ray + 0x220) = auVar161;
              auVar161 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6f0.hit + 0xc0));
              *(undefined1 (*) [32])(local_6f0.ray + 0x240) = auVar161;
              auVar161 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6f0.hit + 0xe0));
              *(undefined1 (*) [32])(local_6f0.ray + 0x260) = auVar161;
              auVar161 = vmaskmovps_avx(auVar99,*(undefined1 (*) [32])(local_6f0.hit + 0x100));
              *(undefined1 (*) [32])(local_6f0.ray + 0x280) = auVar161;
            }
          }
          if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar99 >> 0x7f,0) == '\0') &&
                (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar99 >> 0xbf,0) == '\0') &&
              (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar99[0x1f]) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar131;
          }
          *(undefined4 *)(local_620 + uVar88 * 4) = 0;
          uVar131 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar100._4_4_ = uVar131;
          auVar100._0_4_ = uVar131;
          auVar100._8_4_ = uVar131;
          auVar100._12_4_ = uVar131;
          auVar100._16_4_ = uVar131;
          auVar100._20_4_ = uVar131;
          auVar100._24_4_ = uVar131;
          auVar100._28_4_ = uVar131;
          auVar161 = vcmpps_avx(auVar186._0_32_,auVar100,2);
          local_620 = vandps_avx(auVar161,local_620);
        }
        auVar206 = auVar208._0_32_;
        auVar193 = auVar195._0_32_;
        auVar247 = auVar248._0_32_;
        auVar242 = auVar243._0_32_;
        auVar209 = auVar212._0_28_;
        auVar257 = auVar258._0_32_;
        auVar233 = auVar234._0_32_;
        auVar161 = auVar162._0_32_;
        if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_620 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_620 >> 0x7f,0) == '\0') &&
              (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_620 >> 0xbf,0) == '\0') &&
            (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_620[0x1f]) goto LAB_011caa3e;
        auVar122._8_4_ = 0x7f800000;
        auVar122._0_8_ = 0x7f8000007f800000;
        auVar122._12_4_ = 0x7f800000;
        auVar122._16_4_ = 0x7f800000;
        auVar122._20_4_ = 0x7f800000;
        auVar122._24_4_ = 0x7f800000;
        auVar122._28_4_ = 0x7f800000;
        auVar161 = vblendvps_avx(auVar122,auVar186._0_32_,local_620);
        auVar193 = vshufps_avx(auVar161,auVar161,0xb1);
        auVar193 = vminps_avx(auVar161,auVar193);
        auVar206 = vshufpd_avx(auVar193,auVar193,5);
        auVar193 = vminps_avx(auVar193,auVar206);
        auVar206 = vperm2f128_avx(auVar193,auVar193,1);
        auVar193 = vminps_avx(auVar193,auVar206);
        auVar193 = vcmpps_avx(auVar161,auVar193,0);
        auVar206 = local_620 & auVar193;
        auVar161 = local_620;
        if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar206 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar206 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar206 >> 0x7f,0) != '\0') ||
              (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar206 >> 0xbf,0) != '\0') ||
            (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar206[0x1f] < '\0') {
          auVar161 = vandps_avx(auVar193,local_620);
        }
        uVar82 = vmovmskps_avx(auVar161);
        uVar83 = 0;
        if (uVar82 != 0) {
          for (; (uVar82 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context,  const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }